

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar71;
  long lVar72;
  Geometry *pGVar73;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int iVar74;
  ulong uVar75;
  Primitive *pPVar76;
  uint uVar77;
  ulong uVar78;
  uint uVar79;
  byte bVar80;
  ulong uVar81;
  float fVar82;
  float fVar83;
  float fVar131;
  float fVar132;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar86 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar87 [16];
  float fVar133;
  float fVar135;
  float fVar136;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar88 [16];
  float fVar134;
  float fVar137;
  float fVar138;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar139;
  undefined4 uVar140;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined8 uVar152;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar170;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [64];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [64];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_544;
  Geometry *local_540;
  ulong local_538;
  RayHit *local_530;
  RayQueryContext *local_528;
  Primitive *local_520;
  Precalculations *local_518;
  Primitive *local_510;
  RTCFilterFunctionNArguments local_508;
  uint local_4d8;
  int local_4d4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined4 local_488;
  float local_484;
  undefined4 local_480;
  uint local_47c;
  undefined4 local_478;
  uint local_474;
  uint local_470;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  int local_23c;
  undefined1 local_230 [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar13 = prim[1];
  uVar69 = (ulong)(byte)PVar13;
  lVar22 = uVar69 * 0x19;
  fVar158 = *(float *)(prim + lVar22 + 0x12);
  auVar153 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar22 + 6));
  fVar171 = fVar158 * auVar153._0_4_;
  fVar139 = fVar158 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar92 = vpmovsxbd_avx2(auVar85);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar6);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar103 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6);
  auVar97 = vpmovsxbd_avx2(auVar8);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar95 = vcvtdq2ps_avx(auVar97);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (uint)(byte)PVar13 * 0xc + uVar69 + 6);
  auVar93 = vpmovsxbd_avx2(auVar9);
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar78 = (ulong)(uint)((int)(uVar69 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar96 = vpmovsxbd_avx2(auVar10);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar78 + uVar69 + 6);
  auVar102 = vpmovsxbd_avx2(auVar11);
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar81 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar91 = vpmovsxbd_avx2(auVar12);
  auVar98 = vcvtdq2ps_avx(auVar91);
  auVar202._4_4_ = fVar139;
  auVar202._0_4_ = fVar139;
  auVar202._8_4_ = fVar139;
  auVar202._12_4_ = fVar139;
  auVar202._16_4_ = fVar139;
  auVar202._20_4_ = fVar139;
  auVar202._24_4_ = fVar139;
  auVar202._28_4_ = fVar139;
  auVar204._8_4_ = 1;
  auVar204._0_8_ = 0x100000001;
  auVar204._12_4_ = 1;
  auVar204._16_4_ = 1;
  auVar204._20_4_ = 1;
  auVar204._24_4_ = 1;
  auVar204._28_4_ = 1;
  auVar89 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar208 = ZEXT3264(auVar89);
  auVar100 = ZEXT1632(CONCAT412(fVar158 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar158 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar158 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar139))));
  auVar99 = vpermps_avx2(auVar204,auVar100);
  auVar90 = vpermps_avx512vl(auVar89,auVar100);
  fVar139 = auVar90._0_4_;
  fVar149 = auVar90._4_4_;
  auVar100._4_4_ = fVar149 * auVar104._4_4_;
  auVar100._0_4_ = fVar139 * auVar104._0_4_;
  fVar150 = auVar90._8_4_;
  auVar100._8_4_ = fVar150 * auVar104._8_4_;
  fVar151 = auVar90._12_4_;
  auVar100._12_4_ = fVar151 * auVar104._12_4_;
  fVar170 = auVar90._16_4_;
  auVar100._16_4_ = fVar170 * auVar104._16_4_;
  fVar82 = auVar90._20_4_;
  auVar100._20_4_ = fVar82 * auVar104._20_4_;
  fVar83 = auVar90._24_4_;
  auVar100._24_4_ = fVar83 * auVar104._24_4_;
  auVar100._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar93._4_4_ * fVar149;
  auVar97._0_4_ = auVar93._0_4_ * fVar139;
  auVar97._8_4_ = auVar93._8_4_ * fVar150;
  auVar97._12_4_ = auVar93._12_4_ * fVar151;
  auVar97._16_4_ = auVar93._16_4_ * fVar170;
  auVar97._20_4_ = auVar93._20_4_ * fVar82;
  auVar97._24_4_ = auVar93._24_4_ * fVar83;
  auVar97._28_4_ = auVar91._28_4_;
  auVar91._4_4_ = auVar98._4_4_ * fVar149;
  auVar91._0_4_ = auVar98._0_4_ * fVar139;
  auVar91._8_4_ = auVar98._8_4_ * fVar150;
  auVar91._12_4_ = auVar98._12_4_ * fVar151;
  auVar91._16_4_ = auVar98._16_4_ * fVar170;
  auVar91._20_4_ = auVar98._20_4_ * fVar82;
  auVar91._24_4_ = auVar98._24_4_ * fVar83;
  auVar91._28_4_ = auVar90._28_4_;
  auVar84 = vfmadd231ps_fma(auVar100,auVar99,auVar92);
  auVar85 = vfmadd231ps_fma(auVar97,auVar99,auVar95);
  auVar6 = vfmadd231ps_fma(auVar91,auVar102,auVar99);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar202,auVar94);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar202,auVar103);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar96,auVar202);
  auVar203._4_4_ = fVar171;
  auVar203._0_4_ = fVar171;
  auVar203._8_4_ = fVar171;
  auVar203._12_4_ = fVar171;
  auVar203._16_4_ = fVar171;
  auVar203._20_4_ = fVar171;
  auVar203._24_4_ = fVar171;
  auVar203._28_4_ = fVar171;
  auVar91 = ZEXT1632(CONCAT412(fVar158 * auVar153._12_4_,
                               CONCAT48(fVar158 * auVar153._8_4_,
                                        CONCAT44(fVar158 * auVar153._4_4_,fVar171))));
  auVar97 = vpermps_avx2(auVar204,auVar91);
  auVar91 = vpermps_avx512vl(auVar89,auVar91);
  fVar158 = auVar91._0_4_;
  fVar139 = auVar91._4_4_;
  auVar99._4_4_ = fVar139 * auVar104._4_4_;
  auVar99._0_4_ = fVar158 * auVar104._0_4_;
  fVar149 = auVar91._8_4_;
  auVar99._8_4_ = fVar149 * auVar104._8_4_;
  fVar150 = auVar91._12_4_;
  auVar99._12_4_ = fVar150 * auVar104._12_4_;
  fVar151 = auVar91._16_4_;
  auVar99._16_4_ = fVar151 * auVar104._16_4_;
  fVar170 = auVar91._20_4_;
  auVar99._20_4_ = fVar170 * auVar104._20_4_;
  fVar82 = auVar91._24_4_;
  auVar99._24_4_ = fVar82 * auVar104._24_4_;
  auVar99._28_4_ = 1;
  auVar89._4_4_ = auVar93._4_4_ * fVar139;
  auVar89._0_4_ = auVar93._0_4_ * fVar158;
  auVar89._8_4_ = auVar93._8_4_ * fVar149;
  auVar89._12_4_ = auVar93._12_4_ * fVar150;
  auVar89._16_4_ = auVar93._16_4_ * fVar151;
  auVar89._20_4_ = auVar93._20_4_ * fVar170;
  auVar89._24_4_ = auVar93._24_4_ * fVar82;
  auVar89._28_4_ = auVar104._28_4_;
  auVar93._4_4_ = auVar98._4_4_ * fVar139;
  auVar93._0_4_ = auVar98._0_4_ * fVar158;
  auVar93._8_4_ = auVar98._8_4_ * fVar149;
  auVar93._12_4_ = auVar98._12_4_ * fVar150;
  auVar93._16_4_ = auVar98._16_4_ * fVar151;
  auVar93._20_4_ = auVar98._20_4_ * fVar170;
  auVar93._24_4_ = auVar98._24_4_ * fVar82;
  auVar93._28_4_ = auVar91._28_4_;
  auVar7 = vfmadd231ps_fma(auVar99,auVar97,auVar92);
  auVar8 = vfmadd231ps_fma(auVar89,auVar97,auVar95);
  auVar9 = vfmadd231ps_fma(auVar93,auVar97,auVar102);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar203,auVar94);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar203,auVar103);
  auVar191._8_4_ = 0x7fffffff;
  auVar191._0_8_ = 0x7fffffff7fffffff;
  auVar191._12_4_ = 0x7fffffff;
  auVar191._16_4_ = 0x7fffffff;
  auVar191._20_4_ = 0x7fffffff;
  auVar191._24_4_ = 0x7fffffff;
  auVar191._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar203,auVar96);
  auVar94 = vandps_avx(ZEXT1632(auVar84),auVar191);
  auVar189._8_4_ = 0x219392ef;
  auVar189._0_8_ = 0x219392ef219392ef;
  auVar189._12_4_ = 0x219392ef;
  auVar189._16_4_ = 0x219392ef;
  auVar189._20_4_ = 0x219392ef;
  auVar189._24_4_ = 0x219392ef;
  auVar189._28_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar94,auVar189,1);
  bVar15 = (bool)((byte)uVar78 & 1);
  auVar90._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar84._0_4_;
  bVar15 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar84._4_4_;
  bVar15 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar84._8_4_;
  bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar84._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar85),auVar191);
  uVar78 = vcmpps_avx512vl(auVar94,auVar189,1);
  bVar15 = (bool)((byte)uVar78 & 1);
  auVar101._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._0_4_;
  bVar15 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._4_4_;
  bVar15 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._8_4_;
  bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar6),auVar191);
  uVar78 = vcmpps_avx512vl(auVar94,auVar189,1);
  bVar15 = (bool)((byte)uVar78 & 1);
  auVar94._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar6._0_4_;
  bVar15 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar6._4_4_;
  bVar15 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar6._8_4_;
  bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar6._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar92 = vrcp14ps_avx512vl(auVar90);
  auVar190._8_4_ = 0x3f800000;
  auVar190._0_8_ = 0x3f8000003f800000;
  auVar190._12_4_ = 0x3f800000;
  auVar190._16_4_ = 0x3f800000;
  auVar190._20_4_ = 0x3f800000;
  auVar190._24_4_ = 0x3f800000;
  auVar190._28_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar90,auVar92,auVar190);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar101);
  auVar85 = vfnmadd213ps_fma(auVar101,auVar92,auVar190);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar94);
  auVar6 = vfnmadd213ps_fma(auVar94,auVar92,auVar190);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar92,auVar92);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar7));
  auVar96._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar96._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar96._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar96._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar96._16_4_ = auVar94._16_4_ * 0.0;
  auVar96._20_4_ = auVar94._20_4_ * 0.0;
  auVar96._24_4_ = auVar94._24_4_ * 0.0;
  auVar96._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar7));
  auVar93 = vpbroadcastd_avx512vl();
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar13 * 0x10 + 6));
  auVar167._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar167._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar167._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar167._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar167._16_4_ = auVar94._16_4_ * 0.0;
  auVar167._20_4_ = auVar94._20_4_ * 0.0;
  auVar167._24_4_ = auVar94._24_4_ * 0.0;
  auVar167._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar13 * 0x10 + uVar69 * -2 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar8));
  auVar102._4_4_ = auVar85._4_4_ * auVar94._4_4_;
  auVar102._0_4_ = auVar85._0_4_ * auVar94._0_4_;
  auVar102._8_4_ = auVar85._8_4_ * auVar94._8_4_;
  auVar102._12_4_ = auVar85._12_4_ * auVar94._12_4_;
  auVar102._16_4_ = auVar94._16_4_ * 0.0;
  auVar102._20_4_ = auVar94._20_4_ * 0.0;
  auVar102._24_4_ = auVar94._24_4_ * 0.0;
  auVar102._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar92);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar8));
  auVar156._0_4_ = auVar85._0_4_ * auVar94._0_4_;
  auVar156._4_4_ = auVar85._4_4_ * auVar94._4_4_;
  auVar156._8_4_ = auVar85._8_4_ * auVar94._8_4_;
  auVar156._12_4_ = auVar85._12_4_ * auVar94._12_4_;
  auVar156._16_4_ = auVar94._16_4_ * 0.0;
  auVar156._20_4_ = auVar94._20_4_ * 0.0;
  auVar156._24_4_ = auVar94._24_4_ * 0.0;
  auVar156._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 + uVar69 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar9));
  auVar98._4_4_ = auVar94._4_4_ * auVar6._4_4_;
  auVar98._0_4_ = auVar94._0_4_ * auVar6._0_4_;
  auVar98._8_4_ = auVar94._8_4_ * auVar6._8_4_;
  auVar98._12_4_ = auVar94._12_4_ * auVar6._12_4_;
  auVar98._16_4_ = auVar94._16_4_ * 0.0;
  auVar98._20_4_ = auVar94._20_4_ * 0.0;
  auVar98._24_4_ = auVar94._24_4_ * 0.0;
  auVar98._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar9));
  auVar105._0_4_ = auVar6._0_4_ * auVar94._0_4_;
  auVar105._4_4_ = auVar6._4_4_ * auVar94._4_4_;
  auVar105._8_4_ = auVar6._8_4_ * auVar94._8_4_;
  auVar105._12_4_ = auVar6._12_4_ * auVar94._12_4_;
  auVar105._16_4_ = auVar94._16_4_ * 0.0;
  auVar105._20_4_ = auVar94._20_4_ * 0.0;
  auVar105._24_4_ = auVar94._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar96,auVar167);
  auVar92 = vpminsd_avx2(auVar102,auVar156);
  auVar94 = vmaxps_avx(auVar94,auVar92);
  auVar92 = vpminsd_avx2(auVar98,auVar105);
  uVar140 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar104._4_4_ = uVar140;
  auVar104._0_4_ = uVar140;
  auVar104._8_4_ = uVar140;
  auVar104._12_4_ = uVar140;
  auVar104._16_4_ = uVar140;
  auVar104._20_4_ = uVar140;
  auVar104._24_4_ = uVar140;
  auVar104._28_4_ = uVar140;
  auVar92 = vmaxps_avx512vl(auVar92,auVar104);
  auVar94 = vmaxps_avx(auVar94,auVar92);
  auVar92._8_4_ = 0x3f7ffffa;
  auVar92._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar92._12_4_ = 0x3f7ffffa;
  auVar92._16_4_ = 0x3f7ffffa;
  auVar92._20_4_ = 0x3f7ffffa;
  auVar92._24_4_ = 0x3f7ffffa;
  auVar92._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar94,auVar92);
  auVar94 = vpmaxsd_avx2(auVar96,auVar167);
  auVar92 = vpmaxsd_avx2(auVar102,auVar156);
  auVar94 = vminps_avx(auVar94,auVar92);
  auVar92 = vpmaxsd_avx2(auVar98,auVar105);
  fVar158 = (ray->super_RayK<1>).tfar;
  auVar103._4_4_ = fVar158;
  auVar103._0_4_ = fVar158;
  auVar103._8_4_ = fVar158;
  auVar103._12_4_ = fVar158;
  auVar103._16_4_ = fVar158;
  auVar103._20_4_ = fVar158;
  auVar103._24_4_ = fVar158;
  auVar103._28_4_ = fVar158;
  auVar92 = vminps_avx512vl(auVar92,auVar103);
  auVar94 = vminps_avx(auVar94,auVar92);
  auVar95._8_4_ = 0x3f800003;
  auVar95._0_8_ = 0x3f8000033f800003;
  auVar95._12_4_ = 0x3f800003;
  auVar95._16_4_ = 0x3f800003;
  auVar95._20_4_ = 0x3f800003;
  auVar95._24_4_ = 0x3f800003;
  auVar95._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar95);
  uVar21 = vpcmpgtd_avx512vl(auVar93,_DAT_01fe9900);
  uVar152 = vcmpps_avx512vl(local_80,auVar94,2);
  if ((byte)((byte)uVar152 & (byte)uVar21) != 0) {
    uVar78 = (ulong)(byte)((byte)uVar152 & (byte)uVar21);
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar209 = ZEXT1664(auVar84);
    pPVar76 = prim + lVar22 + 0x16;
    auVar210 = ZEXT464(0x35000000);
    local_528 = context;
    local_530 = ray;
    local_510 = prim;
    local_518 = pre;
    local_520 = pPVar76;
    do {
      lVar22 = 0;
      for (uVar69 = uVar78; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar78 = uVar78 - 1 & uVar78;
      uVar77 = *(uint *)(prim + lVar22 * 4 + 6);
      uVar69 = (ulong)(uint)((int)lVar22 << 6);
      uVar79 = *(uint *)(prim + 2);
      local_538 = (ulong)uVar79;
      pGVar73 = (context->scene->geometries).items[uVar79].ptr;
      local_4d0 = *(undefined1 (*) [16])(pPVar76 + uVar69);
      if (uVar78 != 0) {
        uVar75 = uVar78 - 1 & uVar78;
        for (uVar81 = uVar78; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        }
        if (uVar75 != 0) {
          for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_4a0 = *(undefined1 (*) [16])(pPVar76 + uVar69 + 0x10);
      local_4b0 = *(undefined1 (*) [16])(pPVar76 + uVar69 + 0x20);
      _local_4c0 = *(undefined1 (*) [16])(pPVar76 + uVar69 + 0x30);
      iVar74 = (int)pGVar73[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar3 = (ray->super_RayK<1>).org.field_0;
      auVar85 = vsubps_avx(local_4d0,(undefined1  [16])aVar3);
      uVar140 = auVar85._0_4_;
      auVar153._4_4_ = uVar140;
      auVar153._0_4_ = uVar140;
      auVar153._8_4_ = uVar140;
      auVar153._12_4_ = uVar140;
      auVar84 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      fVar158 = (pre->ray_space).vz.field_0.m128[0];
      fVar139 = (pre->ray_space).vz.field_0.m128[1];
      fVar149 = (pre->ray_space).vz.field_0.m128[2];
      fVar150 = (pre->ray_space).vz.field_0.m128[3];
      auVar194._0_4_ = auVar85._0_4_ * fVar158;
      auVar194._4_4_ = auVar85._4_4_ * fVar139;
      auVar194._8_4_ = auVar85._8_4_ * fVar149;
      auVar194._12_4_ = auVar85._12_4_ * fVar150;
      auVar84 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar5,auVar84);
      auVar6 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar153);
      auVar85 = vsubps_avx(local_4a0,(undefined1  [16])aVar3);
      uVar140 = auVar85._0_4_;
      auVar154._4_4_ = uVar140;
      auVar154._0_4_ = uVar140;
      auVar154._8_4_ = uVar140;
      auVar154._12_4_ = uVar140;
      auVar84 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar87._0_4_ = auVar85._0_4_ * fVar158;
      auVar87._4_4_ = auVar85._4_4_ * fVar139;
      auVar87._8_4_ = auVar85._8_4_ * fVar149;
      auVar87._12_4_ = auVar85._12_4_ * fVar150;
      auVar84 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar5,auVar84);
      auVar7 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar154);
      auVar85 = vsubps_avx512vl(local_4b0,(undefined1  [16])aVar3);
      uVar140 = auVar85._0_4_;
      auVar155._4_4_ = uVar140;
      auVar155._0_4_ = uVar140;
      auVar155._8_4_ = uVar140;
      auVar155._12_4_ = uVar140;
      auVar84 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar198._0_4_ = auVar85._0_4_ * fVar158;
      auVar198._4_4_ = auVar85._4_4_ * fVar139;
      auVar198._8_4_ = auVar85._8_4_ * fVar149;
      auVar198._12_4_ = auVar85._12_4_ * fVar150;
      auVar84 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar84);
      auVar8 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar155);
      local_3c0 = ZEXT1632((undefined1  [16])aVar3);
      auVar85 = vsubps_avx512vl(_local_4c0,(undefined1  [16])aVar3);
      uVar140 = auVar85._0_4_;
      auVar86._4_4_ = uVar140;
      auVar86._0_4_ = uVar140;
      auVar86._8_4_ = uVar140;
      auVar86._12_4_ = uVar140;
      auVar84 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar199._0_4_ = auVar85._0_4_ * fVar158;
      auVar199._4_4_ = auVar85._4_4_ * fVar139;
      auVar199._8_4_ = auVar85._8_4_ * fVar149;
      auVar199._12_4_ = auVar85._12_4_ * fVar150;
      auVar84 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar5,auVar84);
      auVar9 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar86);
      lVar22 = (long)iVar74 * 0x44;
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar22);
      uVar140 = auVar6._0_4_;
      local_2c0._4_4_ = uVar140;
      local_2c0._0_4_ = uVar140;
      local_2c0._8_4_ = uVar140;
      local_2c0._12_4_ = uVar140;
      local_2c0._16_4_ = uVar140;
      local_2c0._20_4_ = uVar140;
      local_2c0._24_4_ = uVar140;
      local_2c0._28_4_ = uVar140;
      auVar141._8_4_ = 1;
      auVar141._0_8_ = 0x100000001;
      auVar141._12_4_ = 1;
      auVar141._16_4_ = 1;
      auVar141._20_4_ = 1;
      auVar141._24_4_ = 1;
      auVar141._28_4_ = 1;
      local_2e0 = vpermps_avx2(auVar141,ZEXT1632(auVar6));
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x484);
      uVar140 = auVar7._0_4_;
      auVar88._4_4_ = uVar140;
      auVar88._0_4_ = uVar140;
      auVar88._8_4_ = uVar140;
      auVar88._12_4_ = uVar140;
      local_300._16_4_ = uVar140;
      local_300._0_16_ = auVar88;
      local_300._20_4_ = uVar140;
      local_300._24_4_ = uVar140;
      local_300._28_4_ = uVar140;
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x908);
      local_320 = vpermps_avx512vl(auVar141,ZEXT1632(auVar7));
      local_340 = vbroadcastss_avx512vl(auVar8);
      local_360 = vpermps_avx512vl(auVar141,ZEXT1632(auVar8));
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0xd8c);
      fVar158 = auVar9._0_4_;
      local_380._4_4_ = fVar158;
      local_380._0_4_ = fVar158;
      fStack_378 = fVar158;
      fStack_374 = fVar158;
      fStack_370 = fVar158;
      fStack_36c = fVar158;
      fStack_368 = fVar158;
      register0x0000139c = fVar158;
      _local_3a0 = vpermps_avx512vl(auVar141,ZEXT1632(auVar9));
      auVar95 = vmulps_avx512vl(_local_380,auVar103);
      auVar93 = vmulps_avx512vl(_local_3a0,auVar103);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar104,local_340);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,local_360);
      auVar84 = vfmadd231ps_fma(auVar95,auVar92,local_300);
      auVar96 = vfmadd231ps_avx512vl(auVar93,auVar92,local_320);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar94,local_2c0);
      auVar188 = ZEXT3264(auVar97);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar22);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x484);
      auVar91 = vfmadd231ps_avx512vl(auVar96,auVar94,local_2e0);
      auVar183 = ZEXT3264(auVar91);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x908);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0xd8c);
      auVar98 = vmulps_avx512vl(_local_380,auVar102);
      auVar99 = vmulps_avx512vl(_local_3a0,auVar102);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,local_340);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_360);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_300);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,local_320);
      auVar10 = vfmadd231ps_fma(auVar98,auVar95,local_2c0);
      auVar192 = ZEXT1664(auVar10);
      auVar11 = vfmadd231ps_fma(auVar99,auVar95,local_2e0);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar10),auVar97);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar11),auVar91);
      auVar98 = vmulps_avx512vl(auVar91,auVar99);
      auVar89 = vmulps_avx512vl(auVar97,auVar100);
      auVar98 = vsubps_avx512vl(auVar98,auVar89);
      auVar84 = vshufps_avx(local_4d0,local_4d0,0xff);
      uVar152 = auVar84._0_8_;
      local_a0._8_8_ = uVar152;
      local_a0._0_8_ = uVar152;
      local_a0._16_8_ = uVar152;
      local_a0._24_8_ = uVar152;
      auVar84 = vshufps_avx(local_4a0,local_4a0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar84);
      auVar84 = vshufps_avx512vl(local_4b0,local_4b0,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar84);
      auVar84 = vshufps_avx512vl(_local_4c0,_local_4c0,0xff);
      uVar152 = auVar84._0_8_;
      local_100._8_8_ = uVar152;
      local_100._0_8_ = uVar152;
      local_100._16_8_ = uVar152;
      local_100._24_8_ = uVar152;
      auVar89 = vmulps_avx512vl(local_100,auVar103);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar104,local_e0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar92,local_c0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,local_a0);
      auVar90 = vmulps_avx512vl(local_100,auVar102);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,local_e0);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar93,local_c0);
      auVar12 = vfmadd231ps_fma(auVar90,auVar95,local_a0);
      auVar90 = vmulps_avx512vl(auVar100,auVar100);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar99,auVar99);
      auVar101 = vmaxps_avx512vl(auVar89,ZEXT1632(auVar12));
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      auVar90 = vmulps_avx512vl(auVar101,auVar90);
      auVar98 = vmulps_avx512vl(auVar98,auVar98);
      uVar152 = vcmpps_avx512vl(auVar98,auVar90,2);
      auVar84 = vblendps_avx(auVar6,local_4d0,8);
      auVar194 = auVar209._0_16_;
      auVar85 = vandps_avx512vl(auVar84,auVar194);
      auVar155 = local_4a0;
      auVar84 = vblendps_avx(auVar7,local_4a0,8);
      auVar84 = vandps_avx512vl(auVar84,auVar194);
      auVar85 = vmaxps_avx(auVar85,auVar84);
      auVar154 = local_4b0;
      auVar84 = vblendps_avx(auVar8,local_4b0,8);
      auVar86 = vandps_avx512vl(auVar84,auVar194);
      auVar153 = _local_4c0;
      auVar84 = vblendps_avx(auVar9,_local_4c0,8);
      auVar84 = vandps_avx512vl(auVar84,auVar194);
      auVar84 = vmaxps_avx(auVar86,auVar84);
      auVar84 = vmaxps_avx(auVar85,auVar84);
      auVar85 = vmovshdup_avx(auVar84);
      auVar85 = vmaxss_avx(auVar85,auVar84);
      auVar84 = vshufpd_avx(auVar84,auVar84,1);
      auVar84 = vmaxss_avx(auVar84,auVar85);
      auVar85 = vcvtsi2ss_avx512f(_local_4c0,iVar74);
      local_440._0_16_ = auVar85;
      auVar201._0_4_ = auVar85._0_4_;
      auVar201._4_4_ = auVar201._0_4_;
      auVar201._8_4_ = auVar201._0_4_;
      auVar201._12_4_ = auVar201._0_4_;
      auVar201._16_4_ = auVar201._0_4_;
      auVar201._20_4_ = auVar201._0_4_;
      auVar201._24_4_ = auVar201._0_4_;
      auVar201._28_4_ = auVar201._0_4_;
      uVar21 = vcmpps_avx512vl(auVar201,_DAT_01faff40,0xe);
      bVar80 = (byte)uVar152 & (byte)uVar21;
      auVar84 = vmulss_avx512f(auVar84,auVar210._0_16_);
      local_420._0_16_ = auVar84;
      auVar98 = local_420;
      auVar101 = auVar208._0_32_;
      auVar90 = vpermps_avx512vl(auVar101,ZEXT1632(auVar6));
      local_140 = vpermps_avx512vl(auVar101,ZEXT1632(auVar7));
      local_160 = vpermps_avx512vl(auVar101,ZEXT1632(auVar8));
      local_180 = vpermps_avx512vl(auVar101,ZEXT1632(auVar9));
      _local_4c0 = auVar153;
      local_4b0 = auVar154;
      local_4a0 = auVar155;
      local_420 = auVar98;
      if (bVar80 != 0) {
        auVar102 = vmulps_avx512vl(local_180,auVar102);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar102);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar96);
        auVar93 = vfmadd213ps_avx512vl(auVar95,auVar90,auVar93);
        auVar103 = vmulps_avx512vl(local_180,auVar103);
        auVar104 = vfmadd213ps_avx512vl(auVar104,local_160,auVar103);
        auVar96 = vfmadd213ps_avx512vl(auVar92,local_140,auVar104);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1694);
        auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1f9c);
        auVar96 = vfmadd213ps_avx512vl(auVar94,auVar90,auVar96);
        auVar196._0_4_ = fVar158 * auVar95._0_4_;
        auVar196._4_4_ = fVar158 * auVar95._4_4_;
        auVar196._8_4_ = fVar158 * auVar95._8_4_;
        auVar196._12_4_ = fVar158 * auVar95._12_4_;
        auVar196._16_4_ = fVar158 * auVar95._16_4_;
        auVar196._20_4_ = fVar158 * auVar95._20_4_;
        auVar196._24_4_ = fVar158 * auVar95._24_4_;
        auVar196._28_4_ = 0;
        auVar94 = vmulps_avx512vl(_local_3a0,auVar95);
        auVar95 = vmulps_avx512vl(local_180,auVar95);
        auVar102 = vfmadd231ps_avx512vl(auVar196,auVar103,local_340);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar103,local_360);
        auVar103 = vfmadd231ps_avx512vl(auVar95,local_160,auVar103);
        auVar95 = vfmadd231ps_avx512vl(auVar102,auVar104,local_300);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar104,local_320);
        auVar102 = vfmadd231ps_avx512vl(auVar103,local_140,auVar104);
        auVar85 = vfmadd231ps_fma(auVar95,auVar92,local_2c0);
        auVar95 = vfmadd231ps_avx512vl(auVar94,auVar92,local_2e0);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1b18);
        auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1f9c);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar92);
        auVar34._4_4_ = fVar158 * auVar103._4_4_;
        auVar34._0_4_ = fVar158 * auVar103._0_4_;
        auVar34._8_4_ = fVar158 * auVar103._8_4_;
        auVar34._12_4_ = fVar158 * auVar103._12_4_;
        auVar34._16_4_ = fVar158 * auVar103._16_4_;
        auVar34._20_4_ = fVar158 * auVar103._20_4_;
        auVar34._24_4_ = fVar158 * auVar103._24_4_;
        auVar34._28_4_ = auVar92._28_4_;
        auVar92 = vmulps_avx512vl(_local_3a0,auVar103);
        auVar103 = vmulps_avx512vl(local_180,auVar103);
        auVar98 = vfmadd231ps_avx512vl(auVar34,auVar104,local_340);
        auVar105 = vfmadd231ps_avx512vl(auVar92,auVar104,local_360);
        auVar207 = ZEXT3264(auVar90);
        auVar104 = vfmadd231ps_avx512vl(auVar103,local_160,auVar104);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1694);
        auVar103 = vfmadd231ps_avx512vl(auVar98,auVar92,local_300);
        auVar98 = vfmadd231ps_avx512vl(auVar105,auVar92,local_320);
        auVar92 = vfmadd231ps_avx512vl(auVar104,local_140,auVar92);
        auVar210 = ZEXT1664(auVar210._0_16_);
        auVar208 = ZEXT3264(auVar101);
        auVar209 = ZEXT1664(auVar194);
        auVar6 = vfmadd231ps_fma(auVar103,auVar94,local_2c0);
        auVar104 = vfmadd231ps_avx512vl(auVar98,auVar94,local_2e0);
        auVar103 = vfmadd231ps_avx512vl(auVar92,auVar90,auVar94);
        auVar205._8_4_ = 0x7fffffff;
        auVar205._0_8_ = 0x7fffffff7fffffff;
        auVar205._12_4_ = 0x7fffffff;
        auVar205._16_4_ = 0x7fffffff;
        auVar205._20_4_ = 0x7fffffff;
        auVar205._24_4_ = 0x7fffffff;
        auVar205._28_4_ = 0x7fffffff;
        auVar94 = vandps_avx(ZEXT1632(auVar85),auVar205);
        auVar92 = vandps_avx(auVar95,auVar205);
        auVar92 = vmaxps_avx(auVar94,auVar92);
        auVar94 = vandps_avx(auVar102,auVar205);
        auVar94 = vmaxps_avx(auVar92,auVar94);
        local_420._0_4_ = auVar84._0_4_;
        auVar200._4_4_ = local_420._0_4_;
        auVar200._0_4_ = local_420._0_4_;
        auVar200._8_4_ = local_420._0_4_;
        auVar200._12_4_ = local_420._0_4_;
        auVar200._16_4_ = local_420._0_4_;
        auVar200._20_4_ = local_420._0_4_;
        auVar200._24_4_ = local_420._0_4_;
        auVar200._28_4_ = local_420._0_4_;
        uVar69 = vcmpps_avx512vl(auVar94,auVar200,1);
        bVar15 = (bool)((byte)uVar69 & 1);
        auVar106._0_4_ = (float)((uint)bVar15 * auVar99._0_4_ | (uint)!bVar15 * auVar85._0_4_);
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar15 * auVar99._4_4_ | (uint)!bVar15 * auVar85._4_4_);
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar15 * auVar99._8_4_ | (uint)!bVar15 * auVar85._8_4_);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar15 * auVar99._12_4_ | (uint)!bVar15 * auVar85._12_4_);
        fVar149 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar99._16_4_);
        auVar106._16_4_ = fVar149;
        fVar158 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar99._20_4_);
        auVar106._20_4_ = fVar158;
        fVar139 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar99._24_4_);
        auVar106._24_4_ = fVar139;
        uVar71 = (uint)(byte)(uVar69 >> 7) * auVar99._28_4_;
        auVar106._28_4_ = uVar71;
        bVar15 = (bool)((byte)uVar69 & 1);
        auVar107._0_4_ = (float)((uint)bVar15 * auVar100._0_4_ | (uint)!bVar15 * auVar95._0_4_);
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar95._4_4_);
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar95._8_4_);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar95._12_4_);
        bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar15 * auVar100._16_4_ | (uint)!bVar15 * auVar95._16_4_);
        bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar15 * auVar100._20_4_ | (uint)!bVar15 * auVar95._20_4_);
        bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar15 * auVar100._24_4_ | (uint)!bVar15 * auVar95._24_4_);
        bVar15 = SUB81(uVar69 >> 7,0);
        auVar107._28_4_ = (uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar95._28_4_;
        auVar94 = vandps_avx(auVar205,ZEXT1632(auVar6));
        auVar92 = vandps_avx(auVar104,auVar205);
        auVar92 = vmaxps_avx(auVar94,auVar92);
        auVar94 = vandps_avx(auVar103,auVar205);
        auVar94 = vmaxps_avx(auVar92,auVar94);
        uVar69 = vcmpps_avx512vl(auVar94,auVar200,1);
        bVar15 = (bool)((byte)uVar69 & 1);
        auVar108._0_4_ = (float)((uint)bVar15 * auVar99._0_4_ | (uint)!bVar15 * auVar6._0_4_);
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar15 * auVar99._4_4_ | (uint)!bVar15 * auVar6._4_4_);
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar15 * auVar99._8_4_ | (uint)!bVar15 * auVar6._8_4_);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar15 * auVar99._12_4_ | (uint)!bVar15 * auVar6._12_4_);
        fVar170 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar99._16_4_);
        auVar108._16_4_ = fVar170;
        fVar151 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar99._20_4_);
        auVar108._20_4_ = fVar151;
        fVar150 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar99._24_4_);
        auVar108._24_4_ = fVar150;
        auVar108._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar99._28_4_;
        bVar15 = (bool)((byte)uVar69 & 1);
        auVar109._0_4_ = (float)((uint)bVar15 * auVar100._0_4_ | (uint)!bVar15 * auVar104._0_4_);
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar104._4_4_);
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar104._8_4_);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar104._12_4_);
        bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar15 * auVar100._16_4_ | (uint)!bVar15 * auVar104._16_4_);
        bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar15 * auVar100._20_4_ | (uint)!bVar15 * auVar104._20_4_);
        bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar15 * auVar100._24_4_ | (uint)!bVar15 * auVar104._24_4_);
        bVar15 = SUB81(uVar69 >> 7,0);
        auVar109._28_4_ = (uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar104._28_4_;
        auVar87 = vxorps_avx512vl(auVar88,auVar88);
        auVar94 = vfmadd213ps_avx512vl(auVar106,auVar106,ZEXT1632(auVar87));
        auVar84 = vfmadd231ps_fma(auVar94,auVar107,auVar107);
        auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
        fVar82 = auVar94._0_4_;
        fVar83 = auVar94._4_4_;
        fVar171 = auVar94._8_4_;
        fVar131 = auVar94._12_4_;
        fVar132 = auVar94._16_4_;
        fVar133 = auVar94._20_4_;
        fVar135 = auVar94._24_4_;
        auVar35._4_4_ = fVar83 * fVar83 * fVar83 * auVar84._4_4_ * -0.5;
        auVar35._0_4_ = fVar82 * fVar82 * fVar82 * auVar84._0_4_ * -0.5;
        auVar35._8_4_ = fVar171 * fVar171 * fVar171 * auVar84._8_4_ * -0.5;
        auVar35._12_4_ = fVar131 * fVar131 * fVar131 * auVar84._12_4_ * -0.5;
        auVar35._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
        auVar35._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
        auVar35._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar35._28_4_ = 0;
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar104 = vfmadd231ps_avx512vl(auVar35,auVar92,auVar94);
        auVar36._4_4_ = auVar107._4_4_ * auVar104._4_4_;
        auVar36._0_4_ = auVar107._0_4_ * auVar104._0_4_;
        auVar36._8_4_ = auVar107._8_4_ * auVar104._8_4_;
        auVar36._12_4_ = auVar107._12_4_ * auVar104._12_4_;
        auVar36._16_4_ = auVar107._16_4_ * auVar104._16_4_;
        auVar36._20_4_ = auVar107._20_4_ * auVar104._20_4_;
        auVar36._24_4_ = auVar107._24_4_ * auVar104._24_4_;
        auVar36._28_4_ = auVar94._28_4_;
        auVar37._4_4_ = auVar104._4_4_ * -auVar106._4_4_;
        auVar37._0_4_ = auVar104._0_4_ * -auVar106._0_4_;
        auVar37._8_4_ = auVar104._8_4_ * -auVar106._8_4_;
        auVar37._12_4_ = auVar104._12_4_ * -auVar106._12_4_;
        auVar37._16_4_ = auVar104._16_4_ * -fVar149;
        auVar37._20_4_ = auVar104._20_4_ * -fVar158;
        auVar37._24_4_ = auVar104._24_4_ * -fVar139;
        auVar37._28_4_ = uVar71 ^ 0x80000000;
        auVar94 = vmulps_avx512vl(auVar104,ZEXT1632(auVar87));
        auVar98 = ZEXT1632(auVar87);
        auVar103 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar98);
        auVar84 = vfmadd231ps_fma(auVar103,auVar109,auVar109);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
        fVar158 = auVar103._0_4_;
        fVar139 = auVar103._4_4_;
        fVar149 = auVar103._8_4_;
        fVar82 = auVar103._12_4_;
        fVar83 = auVar103._16_4_;
        fVar171 = auVar103._20_4_;
        fVar131 = auVar103._24_4_;
        auVar38._4_4_ = fVar139 * fVar139 * fVar139 * auVar84._4_4_ * -0.5;
        auVar38._0_4_ = fVar158 * fVar158 * fVar158 * auVar84._0_4_ * -0.5;
        auVar38._8_4_ = fVar149 * fVar149 * fVar149 * auVar84._8_4_ * -0.5;
        auVar38._12_4_ = fVar82 * fVar82 * fVar82 * auVar84._12_4_ * -0.5;
        auVar38._16_4_ = fVar83 * fVar83 * fVar83 * -0.0;
        auVar38._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar38._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar38._28_4_ = 0;
        auVar92 = vfmadd231ps_avx512vl(auVar38,auVar92,auVar103);
        auVar39._4_4_ = auVar109._4_4_ * auVar92._4_4_;
        auVar39._0_4_ = auVar109._0_4_ * auVar92._0_4_;
        auVar39._8_4_ = auVar109._8_4_ * auVar92._8_4_;
        auVar39._12_4_ = auVar109._12_4_ * auVar92._12_4_;
        auVar39._16_4_ = auVar109._16_4_ * auVar92._16_4_;
        auVar39._20_4_ = auVar109._20_4_ * auVar92._20_4_;
        auVar39._24_4_ = auVar109._24_4_ * auVar92._24_4_;
        auVar39._28_4_ = auVar103._28_4_;
        auVar40._4_4_ = -auVar108._4_4_ * auVar92._4_4_;
        auVar40._0_4_ = -auVar108._0_4_ * auVar92._0_4_;
        auVar40._8_4_ = -auVar108._8_4_ * auVar92._8_4_;
        auVar40._12_4_ = -auVar108._12_4_ * auVar92._12_4_;
        auVar40._16_4_ = -fVar170 * auVar92._16_4_;
        auVar40._20_4_ = -fVar151 * auVar92._20_4_;
        auVar40._24_4_ = -fVar150 * auVar92._24_4_;
        auVar40._28_4_ = auVar104._28_4_;
        auVar92 = vmulps_avx512vl(auVar92,auVar98);
        auVar84 = vfmadd213ps_fma(auVar36,auVar89,auVar97);
        auVar85 = vfmadd213ps_fma(auVar37,auVar89,auVar91);
        auVar104 = vfmadd213ps_avx512vl(auVar94,auVar89,auVar96);
        auVar103 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar12),ZEXT1632(auVar10));
        auVar86 = vfnmadd213ps_fma(auVar36,auVar89,auVar97);
        auVar102 = ZEXT1632(auVar12);
        auVar6 = vfmadd213ps_fma(auVar40,auVar102,ZEXT1632(auVar11));
        auVar88 = vfnmadd213ps_fma(auVar37,auVar89,auVar91);
        auVar7 = vfmadd213ps_fma(auVar92,auVar102,auVar93);
        auVar95 = vfnmadd231ps_avx512vl(auVar96,auVar89,auVar94);
        auVar10 = vfnmadd213ps_fma(auVar39,auVar102,ZEXT1632(auVar10));
        auVar11 = vfnmadd213ps_fma(auVar40,auVar102,ZEXT1632(auVar11));
        auVar194 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar12),auVar92);
        auVar92 = vsubps_avx512vl(auVar103,ZEXT1632(auVar86));
        auVar94 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar88));
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar7),auVar95);
        auVar96 = vmulps_avx512vl(auVar94,auVar95);
        auVar8 = vfmsub231ps_fma(auVar96,ZEXT1632(auVar88),auVar93);
        auVar41._4_4_ = auVar86._4_4_ * auVar93._4_4_;
        auVar41._0_4_ = auVar86._0_4_ * auVar93._0_4_;
        auVar41._8_4_ = auVar86._8_4_ * auVar93._8_4_;
        auVar41._12_4_ = auVar86._12_4_ * auVar93._12_4_;
        auVar41._16_4_ = auVar93._16_4_ * 0.0;
        auVar41._20_4_ = auVar93._20_4_ * 0.0;
        auVar41._24_4_ = auVar93._24_4_ * 0.0;
        auVar41._28_4_ = auVar93._28_4_;
        auVar93 = vfmsub231ps_avx512vl(auVar41,auVar95,auVar92);
        auVar42._4_4_ = auVar88._4_4_ * auVar92._4_4_;
        auVar42._0_4_ = auVar88._0_4_ * auVar92._0_4_;
        auVar42._8_4_ = auVar88._8_4_ * auVar92._8_4_;
        auVar42._12_4_ = auVar88._12_4_ * auVar92._12_4_;
        auVar42._16_4_ = auVar92._16_4_ * 0.0;
        auVar42._20_4_ = auVar92._20_4_ * 0.0;
        auVar42._24_4_ = auVar92._24_4_ * 0.0;
        auVar42._28_4_ = auVar92._28_4_;
        auVar9 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar86),auVar94);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar98,auVar93);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar98,ZEXT1632(auVar8));
        auVar99 = ZEXT1632(auVar87);
        uVar69 = vcmpps_avx512vl(auVar94,auVar99,2);
        bVar68 = (byte)uVar69;
        fVar82 = (float)((uint)(bVar68 & 1) * auVar84._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar10._0_4_);
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar171 = (float)((uint)bVar15 * auVar84._4_4_ | (uint)!bVar15 * auVar10._4_4_);
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar132 = (float)((uint)bVar15 * auVar84._8_4_ | (uint)!bVar15 * auVar10._8_4_);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar135 = (float)((uint)bVar15 * auVar84._12_4_ | (uint)!bVar15 * auVar10._12_4_);
        auVar96 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(fVar171,fVar82))));
        fVar83 = (float)((uint)(bVar68 & 1) * auVar85._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar11._0_4_);
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar131 = (float)((uint)bVar15 * auVar85._4_4_ | (uint)!bVar15 * auVar11._4_4_);
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar133 = (float)((uint)bVar15 * auVar85._8_4_ | (uint)!bVar15 * auVar11._8_4_);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar136 = (float)((uint)bVar15 * auVar85._12_4_ | (uint)!bVar15 * auVar11._12_4_);
        auVar102 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar133,CONCAT44(fVar131,fVar83))));
        auVar110._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar104._0_4_ |
                    (uint)!(bool)(bVar68 & 1) * auVar194._0_4_);
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar194._4_4_);
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar194._8_4_);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar194._12_4_);
        fVar149 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar104._16_4_);
        auVar110._16_4_ = fVar149;
        fVar139 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar104._20_4_);
        auVar110._20_4_ = fVar139;
        fVar158 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar104._24_4_);
        auVar110._24_4_ = fVar158;
        iVar1 = (uint)(byte)(uVar69 >> 7) * auVar104._28_4_;
        auVar110._28_4_ = iVar1;
        auVar92 = vblendmps_avx512vl(ZEXT1632(auVar86),auVar103);
        auVar111._0_4_ =
             (uint)(bVar68 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar8._0_4_;
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar8._4_4_;
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar8._8_4_;
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar8._12_4_;
        auVar111._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar92._16_4_;
        auVar111._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar92._20_4_;
        auVar111._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar92._24_4_;
        auVar111._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar92._28_4_;
        auVar92 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar6));
        auVar112._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar85._0_4_)
        ;
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar85._4_4_);
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar85._8_4_);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar85._12_4_);
        fVar170 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar92._16_4_);
        auVar112._16_4_ = fVar170;
        fVar151 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar92._20_4_);
        auVar112._20_4_ = fVar151;
        fVar150 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar92._24_4_);
        auVar112._24_4_ = fVar150;
        auVar112._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar92._28_4_;
        auVar92 = vblendmps_avx512vl(auVar95,ZEXT1632(auVar7));
        auVar113._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar104._0_4_
                    );
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar104._4_4_);
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar104._8_4_);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar104._12_4_);
        bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar15 * auVar92._16_4_ | (uint)!bVar15 * auVar104._16_4_);
        bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar15 * auVar92._20_4_ | (uint)!bVar15 * auVar104._20_4_);
        bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar15 * auVar92._24_4_ | (uint)!bVar15 * auVar104._24_4_);
        bVar15 = SUB81(uVar69 >> 7,0);
        auVar113._28_4_ = (uint)bVar15 * auVar92._28_4_ | (uint)!bVar15 * auVar104._28_4_;
        auVar114._0_4_ =
             (uint)(bVar68 & 1) * (int)auVar86._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar103._0_4_;
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar15 * (int)auVar86._4_4_ | (uint)!bVar15 * auVar103._4_4_;
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar15 * (int)auVar86._8_4_ | (uint)!bVar15 * auVar103._8_4_;
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar15 * (int)auVar86._12_4_ | (uint)!bVar15 * auVar103._12_4_;
        auVar114._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar103._16_4_;
        auVar114._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar103._20_4_;
        auVar114._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar103._24_4_;
        auVar114._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar103._28_4_;
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar115._0_4_ =
             (uint)(bVar68 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar7._0_4_;
        bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar16 * auVar95._4_4_ | (uint)!bVar16 * auVar7._4_4_;
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar16 * auVar95._8_4_ | (uint)!bVar16 * auVar7._8_4_;
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar16 * auVar95._12_4_ | (uint)!bVar16 * auVar7._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar95._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar95._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar95._24_4_;
        iVar2 = (uint)(byte)(uVar69 >> 7) * auVar95._28_4_;
        auVar115._28_4_ = iVar2;
        auVar98 = vsubps_avx512vl(auVar114,auVar96);
        auVar92 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar88._12_4_ |
                                                (uint)!bVar18 * auVar6._12_4_,
                                                CONCAT48((uint)bVar17 * (int)auVar88._8_4_ |
                                                         (uint)!bVar17 * auVar6._8_4_,
                                                         CONCAT44((uint)bVar15 * (int)auVar88._4_4_
                                                                  | (uint)!bVar15 * auVar6._4_4_,
                                                                  (uint)(bVar68 & 1) *
                                                                  (int)auVar88._0_4_ |
                                                                  (uint)!(bool)(bVar68 & 1) *
                                                                  auVar6._0_4_)))),auVar102);
        auVar188 = ZEXT3264(auVar92);
        auVar104 = vsubps_avx(auVar115,auVar110);
        auVar103 = vsubps_avx(auVar96,auVar111);
        auVar192 = ZEXT3264(auVar103);
        auVar95 = vsubps_avx(auVar102,auVar112);
        auVar93 = vsubps_avx(auVar110,auVar113);
        auVar43._4_4_ = auVar104._4_4_ * fVar171;
        auVar43._0_4_ = auVar104._0_4_ * fVar82;
        auVar43._8_4_ = auVar104._8_4_ * fVar132;
        auVar43._12_4_ = auVar104._12_4_ * fVar135;
        auVar43._16_4_ = auVar104._16_4_ * 0.0;
        auVar43._20_4_ = auVar104._20_4_ * 0.0;
        auVar43._24_4_ = auVar104._24_4_ * 0.0;
        auVar43._28_4_ = iVar2;
        auVar84 = vfmsub231ps_fma(auVar43,auVar110,auVar98);
        auVar44._4_4_ = fVar131 * auVar98._4_4_;
        auVar44._0_4_ = fVar83 * auVar98._0_4_;
        auVar44._8_4_ = fVar133 * auVar98._8_4_;
        auVar44._12_4_ = fVar136 * auVar98._12_4_;
        auVar44._16_4_ = auVar98._16_4_ * 0.0;
        auVar44._20_4_ = auVar98._20_4_ * 0.0;
        auVar44._24_4_ = auVar98._24_4_ * 0.0;
        auVar44._28_4_ = auVar94._28_4_;
        auVar85 = vfmsub231ps_fma(auVar44,auVar96,auVar92);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar99,ZEXT1632(auVar84));
        auVar179._0_4_ = auVar92._0_4_ * auVar110._0_4_;
        auVar179._4_4_ = auVar92._4_4_ * auVar110._4_4_;
        auVar179._8_4_ = auVar92._8_4_ * auVar110._8_4_;
        auVar179._12_4_ = auVar92._12_4_ * auVar110._12_4_;
        auVar179._16_4_ = auVar92._16_4_ * fVar149;
        auVar179._20_4_ = auVar92._20_4_ * fVar139;
        auVar179._24_4_ = auVar92._24_4_ * fVar158;
        auVar179._28_4_ = 0;
        auVar84 = vfmsub231ps_fma(auVar179,auVar102,auVar104);
        auVar97 = vfmadd231ps_avx512vl(auVar94,auVar99,ZEXT1632(auVar84));
        auVar94 = vmulps_avx512vl(auVar93,auVar111);
        auVar94 = vfmsub231ps_avx512vl(auVar94,auVar103,auVar113);
        auVar45._4_4_ = auVar95._4_4_ * auVar113._4_4_;
        auVar45._0_4_ = auVar95._0_4_ * auVar113._0_4_;
        auVar45._8_4_ = auVar95._8_4_ * auVar113._8_4_;
        auVar45._12_4_ = auVar95._12_4_ * auVar113._12_4_;
        auVar45._16_4_ = auVar95._16_4_ * auVar113._16_4_;
        auVar45._20_4_ = auVar95._20_4_ * auVar113._20_4_;
        auVar45._24_4_ = auVar95._24_4_ * auVar113._24_4_;
        auVar45._28_4_ = auVar113._28_4_;
        auVar84 = vfmsub231ps_fma(auVar45,auVar112,auVar93);
        auVar180._0_4_ = auVar112._0_4_ * auVar103._0_4_;
        auVar180._4_4_ = auVar112._4_4_ * auVar103._4_4_;
        auVar180._8_4_ = auVar112._8_4_ * auVar103._8_4_;
        auVar180._12_4_ = auVar112._12_4_ * auVar103._12_4_;
        auVar180._16_4_ = fVar170 * auVar103._16_4_;
        auVar180._20_4_ = fVar151 * auVar103._20_4_;
        auVar180._24_4_ = fVar150 * auVar103._24_4_;
        auVar180._28_4_ = 0;
        auVar85 = vfmsub231ps_fma(auVar180,auVar95,auVar111);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar99,auVar94);
        auVar91 = vfmadd231ps_avx512vl(auVar94,auVar99,ZEXT1632(auVar84));
        auVar183 = ZEXT3264(auVar91);
        auVar94 = vmaxps_avx(auVar97,auVar91);
        uVar152 = vcmpps_avx512vl(auVar94,auVar99,2);
        bVar80 = bVar80 & (byte)uVar152;
        if (bVar80 != 0) {
          auVar46._4_4_ = auVar93._4_4_ * auVar92._4_4_;
          auVar46._0_4_ = auVar93._0_4_ * auVar92._0_4_;
          auVar46._8_4_ = auVar93._8_4_ * auVar92._8_4_;
          auVar46._12_4_ = auVar93._12_4_ * auVar92._12_4_;
          auVar46._16_4_ = auVar93._16_4_ * auVar92._16_4_;
          auVar46._20_4_ = auVar93._20_4_ * auVar92._20_4_;
          auVar46._24_4_ = auVar93._24_4_ * auVar92._24_4_;
          auVar46._28_4_ = auVar94._28_4_;
          auVar7 = vfmsub231ps_fma(auVar46,auVar95,auVar104);
          auVar47._4_4_ = auVar104._4_4_ * auVar103._4_4_;
          auVar47._0_4_ = auVar104._0_4_ * auVar103._0_4_;
          auVar47._8_4_ = auVar104._8_4_ * auVar103._8_4_;
          auVar47._12_4_ = auVar104._12_4_ * auVar103._12_4_;
          auVar47._16_4_ = auVar104._16_4_ * auVar103._16_4_;
          auVar47._20_4_ = auVar104._20_4_ * auVar103._20_4_;
          auVar47._24_4_ = auVar104._24_4_ * auVar103._24_4_;
          auVar47._28_4_ = auVar104._28_4_;
          auVar6 = vfmsub231ps_fma(auVar47,auVar98,auVar93);
          auVar48._4_4_ = auVar95._4_4_ * auVar98._4_4_;
          auVar48._0_4_ = auVar95._0_4_ * auVar98._0_4_;
          auVar48._8_4_ = auVar95._8_4_ * auVar98._8_4_;
          auVar48._12_4_ = auVar95._12_4_ * auVar98._12_4_;
          auVar48._16_4_ = auVar95._16_4_ * auVar98._16_4_;
          auVar48._20_4_ = auVar95._20_4_ * auVar98._20_4_;
          auVar48._24_4_ = auVar95._24_4_ * auVar98._24_4_;
          auVar48._28_4_ = auVar95._28_4_;
          auVar8 = vfmsub231ps_fma(auVar48,auVar103,auVar92);
          auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar8));
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar84),ZEXT1632(auVar7),ZEXT1232(ZEXT412(0)) << 0x20)
          ;
          auVar94 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
          auVar192 = ZEXT3264(auVar94);
          auVar23._8_4_ = 0x3f800000;
          auVar23._0_8_ = 0x3f8000003f800000;
          auVar23._12_4_ = 0x3f800000;
          auVar23._16_4_ = 0x3f800000;
          auVar23._20_4_ = 0x3f800000;
          auVar23._24_4_ = 0x3f800000;
          auVar23._28_4_ = 0x3f800000;
          auVar92 = vfnmadd213ps_avx512vl(auVar94,ZEXT1632(auVar85),auVar23);
          auVar84 = vfmadd132ps_fma(auVar92,auVar94,auVar94);
          auVar188 = ZEXT1664(auVar84);
          auVar49._4_4_ = auVar8._4_4_ * auVar110._4_4_;
          auVar49._0_4_ = auVar8._0_4_ * auVar110._0_4_;
          auVar49._8_4_ = auVar8._8_4_ * auVar110._8_4_;
          auVar49._12_4_ = auVar8._12_4_ * auVar110._12_4_;
          auVar49._16_4_ = fVar149 * 0.0;
          auVar49._20_4_ = fVar139 * 0.0;
          auVar49._24_4_ = fVar158 * 0.0;
          auVar49._28_4_ = iVar1;
          auVar6 = vfmadd231ps_fma(auVar49,auVar102,ZEXT1632(auVar6));
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar96,ZEXT1632(auVar7));
          fVar139 = auVar84._0_4_;
          fVar149 = auVar84._4_4_;
          fVar150 = auVar84._8_4_;
          fVar151 = auVar84._12_4_;
          local_260 = ZEXT1632(CONCAT412(auVar6._12_4_ * fVar151,
                                         CONCAT48(auVar6._8_4_ * fVar150,
                                                  CONCAT44(auVar6._4_4_ * fVar149,
                                                           auVar6._0_4_ * fVar139))));
          auVar195 = ZEXT3264(local_260);
          auVar142._8_4_ = 3;
          auVar142._0_8_ = 0x300000003;
          auVar142._12_4_ = 3;
          auVar142._16_4_ = 3;
          auVar142._20_4_ = 3;
          auVar142._24_4_ = 3;
          auVar142._28_4_ = 3;
          auVar94 = vpermps_avx2(auVar142,ZEXT1632((undefined1  [16])aVar3));
          uVar152 = vcmpps_avx512vl(auVar94,local_260,2);
          fVar158 = (ray->super_RayK<1>).tfar;
          auVar24._4_4_ = fVar158;
          auVar24._0_4_ = fVar158;
          auVar24._8_4_ = fVar158;
          auVar24._12_4_ = fVar158;
          auVar24._16_4_ = fVar158;
          auVar24._20_4_ = fVar158;
          auVar24._24_4_ = fVar158;
          auVar24._28_4_ = fVar158;
          uVar21 = vcmpps_avx512vl(local_260,auVar24,2);
          bVar80 = (byte)uVar152 & (byte)uVar21 & bVar80;
          if (bVar80 != 0) {
            uVar81 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar81 = bVar80 & uVar81;
            if ((char)uVar81 != '\0') {
              fVar158 = auVar97._0_4_ * fVar139;
              fVar170 = auVar97._4_4_ * fVar149;
              auVar50._4_4_ = fVar170;
              auVar50._0_4_ = fVar158;
              fVar82 = auVar97._8_4_ * fVar150;
              auVar50._8_4_ = fVar82;
              fVar83 = auVar97._12_4_ * fVar151;
              auVar50._12_4_ = fVar83;
              fVar171 = auVar97._16_4_ * 0.0;
              auVar50._16_4_ = fVar171;
              fVar131 = auVar97._20_4_ * 0.0;
              auVar50._20_4_ = fVar131;
              fVar132 = auVar97._24_4_ * 0.0;
              auVar50._24_4_ = fVar132;
              auVar50._28_4_ = auVar97._28_4_;
              auVar143._8_4_ = 0x3f800000;
              auVar143._0_8_ = 0x3f8000003f800000;
              auVar143._12_4_ = 0x3f800000;
              auVar143._16_4_ = 0x3f800000;
              auVar143._20_4_ = 0x3f800000;
              auVar143._24_4_ = 0x3f800000;
              auVar143._28_4_ = 0x3f800000;
              auVar94 = vsubps_avx(auVar143,auVar50);
              local_2a0._0_4_ =
                   (float)((uint)(bVar68 & 1) * (int)fVar158 |
                          (uint)!(bool)(bVar68 & 1) * auVar94._0_4_);
              bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
              local_2a0._4_4_ = (float)((uint)bVar15 * (int)fVar170 | (uint)!bVar15 * auVar94._4_4_)
              ;
              bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
              local_2a0._8_4_ = (float)((uint)bVar15 * (int)fVar82 | (uint)!bVar15 * auVar94._8_4_);
              bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
              local_2a0._12_4_ =
                   (float)((uint)bVar15 * (int)fVar83 | (uint)!bVar15 * auVar94._12_4_);
              bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
              local_2a0._16_4_ =
                   (float)((uint)bVar15 * (int)fVar171 | (uint)!bVar15 * auVar94._16_4_);
              bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
              local_2a0._20_4_ =
                   (float)((uint)bVar15 * (int)fVar131 | (uint)!bVar15 * auVar94._20_4_);
              bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
              local_2a0._24_4_ =
                   (float)((uint)bVar15 * (int)fVar132 | (uint)!bVar15 * auVar94._24_4_);
              bVar15 = SUB81(uVar69 >> 7,0);
              local_2a0._28_4_ =
                   (float)((uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * auVar94._28_4_);
              auVar94 = vsubps_avx(ZEXT1632(auVar12),auVar89);
              auVar84 = vfmadd213ps_fma(auVar94,local_2a0,auVar89);
              fVar158 = pre->depth_scale;
              auVar25._4_4_ = fVar158;
              auVar25._0_4_ = fVar158;
              auVar25._8_4_ = fVar158;
              auVar25._12_4_ = fVar158;
              auVar25._16_4_ = fVar158;
              auVar25._20_4_ = fVar158;
              auVar25._24_4_ = fVar158;
              auVar25._28_4_ = fVar158;
              auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                                           CONCAT48(auVar84._8_4_ + auVar84._8_4_,
                                                                    CONCAT44(auVar84._4_4_ +
                                                                             auVar84._4_4_,
                                                                             auVar84._0_4_ +
                                                                             auVar84._0_4_)))),
                                        auVar25);
              uVar75 = vcmpps_avx512vl(local_260,auVar94,6);
              uVar81 = uVar81 & uVar75;
              bVar80 = (byte)uVar81;
              if (bVar80 != 0) {
                auVar168._0_4_ = auVar91._0_4_ * fVar139;
                auVar168._4_4_ = auVar91._4_4_ * fVar149;
                auVar168._8_4_ = auVar91._8_4_ * fVar150;
                auVar168._12_4_ = auVar91._12_4_ * fVar151;
                auVar168._16_4_ = auVar91._16_4_ * 0.0;
                auVar168._20_4_ = auVar91._20_4_ * 0.0;
                auVar168._24_4_ = auVar91._24_4_ * 0.0;
                auVar168._28_4_ = 0;
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = 0x3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar94 = vsubps_avx(auVar176,auVar168);
                auVar116._0_4_ =
                     (uint)(bVar68 & 1) * (int)auVar168._0_4_ |
                     (uint)!(bool)(bVar68 & 1) * auVar94._0_4_;
                bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
                auVar116._4_4_ = (uint)bVar15 * (int)auVar168._4_4_ | (uint)!bVar15 * auVar94._4_4_;
                bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
                auVar116._8_4_ = (uint)bVar15 * (int)auVar168._8_4_ | (uint)!bVar15 * auVar94._8_4_;
                bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
                auVar116._12_4_ =
                     (uint)bVar15 * (int)auVar168._12_4_ | (uint)!bVar15 * auVar94._12_4_;
                bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
                auVar116._16_4_ =
                     (uint)bVar15 * (int)auVar168._16_4_ | (uint)!bVar15 * auVar94._16_4_;
                bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
                auVar116._20_4_ =
                     (uint)bVar15 * (int)auVar168._20_4_ | (uint)!bVar15 * auVar94._20_4_;
                bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
                auVar116._24_4_ =
                     (uint)bVar15 * (int)auVar168._24_4_ | (uint)!bVar15 * auVar94._24_4_;
                auVar116._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar94._28_4_;
                auVar26._8_4_ = 0x40000000;
                auVar26._0_8_ = 0x4000000040000000;
                auVar26._12_4_ = 0x40000000;
                auVar26._16_4_ = 0x40000000;
                auVar26._20_4_ = 0x40000000;
                auVar26._24_4_ = 0x40000000;
                auVar26._28_4_ = 0x40000000;
                local_280 = vfmsub132ps_avx512vl(auVar116,auVar176,auVar26);
                local_240 = 0;
                local_23c = iVar74;
                auVar192 = ZEXT1664(local_4d0);
                local_230 = local_4d0;
                local_220 = local_4a0._0_8_;
                uStack_218 = local_4a0._8_8_;
                local_210 = local_4b0._0_8_;
                uStack_208 = local_4b0._8_8_;
                local_200 = local_4c0;
                uStack_1f8 = uStack_4b8;
                if ((pGVar73->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar158 = 1.0 / auVar201._0_4_;
                  local_1e0[0] = fVar158 * (local_2a0._0_4_ + 0.0);
                  local_1e0[1] = fVar158 * (local_2a0._4_4_ + 1.0);
                  local_1e0[2] = fVar158 * (local_2a0._8_4_ + 2.0);
                  local_1e0[3] = fVar158 * (local_2a0._12_4_ + 3.0);
                  fStack_1d0 = fVar158 * (local_2a0._16_4_ + 4.0);
                  fStack_1cc = fVar158 * (local_2a0._20_4_ + 5.0);
                  fStack_1c8 = fVar158 * (local_2a0._24_4_ + 6.0);
                  fStack_1c4 = local_2a0._28_4_ + 7.0;
                  local_1c0 = local_280;
                  local_1a0 = local_260;
                  auVar144._8_4_ = 0x7f800000;
                  auVar144._0_8_ = 0x7f8000007f800000;
                  auVar144._12_4_ = 0x7f800000;
                  auVar144._16_4_ = 0x7f800000;
                  auVar144._20_4_ = 0x7f800000;
                  auVar144._24_4_ = 0x7f800000;
                  auVar144._28_4_ = 0x7f800000;
                  auVar94 = vblendmps_avx512vl(auVar144,local_260);
                  auVar117._0_4_ =
                       (uint)(bVar80 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar117._4_4_ = (uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar117._8_4_ = (uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar117._12_4_ = (uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar117._16_4_ = (uint)bVar15 * auVar94._16_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar117._20_4_ = (uint)bVar15 * auVar94._20_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar117._24_4_ = (uint)bVar15 * auVar94._24_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = SUB81(uVar81 >> 7,0);
                  auVar117._28_4_ = (uint)bVar15 * auVar94._28_4_ | (uint)!bVar15 * 0x7f800000;
                  auVar94 = vshufps_avx(auVar117,auVar117,0xb1);
                  auVar94 = vminps_avx(auVar117,auVar94);
                  auVar92 = vshufpd_avx(auVar94,auVar94,5);
                  auVar94 = vminps_avx(auVar94,auVar92);
                  auVar92 = vpermpd_avx2(auVar94,0x4e);
                  auVar94 = vminps_avx(auVar94,auVar92);
                  uVar152 = vcmpps_avx512vl(auVar117,auVar94,0);
                  uVar71 = (uint)uVar81;
                  if (((byte)uVar152 & bVar80) != 0) {
                    uVar71 = (uint)((byte)uVar152 & bVar80);
                  }
                  uVar70 = 0;
                  for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                    uVar70 = uVar70 + 1;
                  }
                  uVar69 = (ulong)uVar70;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar73->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_3e0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    local_540 = pGVar73;
                    _local_400 = local_260;
                    local_460 = auVar90;
                    do {
                      local_484 = local_1e0[uVar69];
                      local_480 = *(undefined4 *)(local_1c0 + uVar69 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar69 * 4);
                      local_508.context = context->user;
                      fVar139 = 1.0 - local_484;
                      fVar158 = fVar139 * fVar139 * -3.0;
                      auVar183 = ZEXT464((uint)fVar158);
                      auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139)),
                                                ZEXT416((uint)(local_484 * fVar139)),
                                                ZEXT416(0xc0000000));
                      auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_484 * fVar139)),
                                                ZEXT416((uint)(local_484 * local_484)),
                                                ZEXT416(0x40000000));
                      fVar139 = auVar84._0_4_ * 3.0;
                      fVar149 = auVar85._0_4_ * 3.0;
                      fVar150 = local_484 * local_484 * 3.0;
                      auVar187._0_4_ = fVar150 * (float)local_4c0._0_4_;
                      auVar187._4_4_ = fVar150 * (float)local_4c0._4_4_;
                      auVar187._8_4_ = fVar150 * (float)uStack_4b8;
                      auVar187._12_4_ = fVar150 * uStack_4b8._4_4_;
                      auVar188 = ZEXT1664(auVar187);
                      auVar165._4_4_ = fVar149;
                      auVar165._0_4_ = fVar149;
                      auVar165._8_4_ = fVar149;
                      auVar165._12_4_ = fVar149;
                      auVar84 = vfmadd132ps_fma(auVar165,auVar187,local_4b0);
                      auVar175._4_4_ = fVar139;
                      auVar175._0_4_ = fVar139;
                      auVar175._8_4_ = fVar139;
                      auVar175._12_4_ = fVar139;
                      auVar84 = vfmadd132ps_fma(auVar175,auVar84,local_4a0);
                      auVar166._4_4_ = fVar158;
                      auVar166._0_4_ = fVar158;
                      auVar166._8_4_ = fVar158;
                      auVar166._12_4_ = fVar158;
                      auVar84 = vfmadd213ps_fma(auVar166,auVar192._0_16_,auVar84);
                      local_490 = vmovlps_avx(auVar84);
                      local_488 = vextractps_avx(auVar84,2);
                      local_47c = uVar77;
                      local_478 = (int)local_538;
                      local_474 = (local_508.context)->instID[0];
                      local_470 = (local_508.context)->instPrimID[0];
                      local_544 = -1;
                      local_508.valid = &local_544;
                      local_508.geometryUserPtr = pGVar73->userPtr;
                      local_508.ray = (RTCRayN *)ray;
                      local_508.hit = (RTCHitN *)&local_490;
                      local_508.N = 1;
                      if (pGVar73->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c80dda:
                        p_Var14 = context->args->filter;
                        if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar73->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar183 = ZEXT1664(auVar183._0_16_);
                          auVar188 = ZEXT1664(auVar188._0_16_);
                          (*p_Var14)(&local_508);
                          auVar195 = ZEXT3264(_local_400);
                          auVar207 = ZEXT3264(local_460);
                          auVar192 = ZEXT1664(local_4d0);
                          auVar210 = ZEXT464(0x35000000);
                          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar209 = ZEXT1664(auVar84);
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar208 = ZEXT3264(auVar94);
                          pGVar73 = local_540;
                          ray = local_530;
                          context = local_528;
                          if (*local_508.valid == 0) goto LAB_01c80ea8;
                        }
                        (((Vec3f *)((long)local_508.ray + 0x30))->field_0).components[0] =
                             *(float *)local_508.hit;
                        (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_508.hit + 4);
                        (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_508.hit + 8);
                        *(float *)((long)local_508.ray + 0x3c) = *(float *)(local_508.hit + 0xc);
                        *(float *)((long)local_508.ray + 0x40) = *(float *)(local_508.hit + 0x10);
                        *(float *)((long)local_508.ray + 0x44) = *(float *)(local_508.hit + 0x14);
                        *(float *)((long)local_508.ray + 0x48) = *(float *)(local_508.hit + 0x18);
                        *(float *)((long)local_508.ray + 0x4c) = *(float *)(local_508.hit + 0x1c);
                        *(float *)((long)local_508.ray + 0x50) = *(float *)(local_508.hit + 0x20);
                      }
                      else {
                        auVar183 = ZEXT464((uint)fVar158);
                        auVar188 = ZEXT1664(auVar187);
                        (*pGVar73->intersectionFilterN)(&local_508);
                        auVar195 = ZEXT3264(_local_400);
                        auVar207 = ZEXT3264(local_460);
                        auVar192 = ZEXT1664(local_4d0);
                        auVar210 = ZEXT464(0x35000000);
                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar209 = ZEXT1664(auVar84);
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar208 = ZEXT3264(auVar94);
                        pGVar73 = local_540;
                        ray = local_530;
                        context = local_528;
                        if (*local_508.valid != 0) goto LAB_01c80dda;
LAB_01c80ea8:
                        auVar210 = ZEXT464(0x35000000);
                        (local_530->super_RayK<1>).tfar = (float)local_3e0._0_4_;
                        pGVar73 = local_540;
                        ray = local_530;
                        context = local_528;
                      }
                      auVar90 = auVar207._0_32_;
                      bVar80 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar81;
                      fVar158 = (ray->super_RayK<1>).tfar;
                      auVar33._4_4_ = fVar158;
                      auVar33._0_4_ = fVar158;
                      auVar33._8_4_ = fVar158;
                      auVar33._12_4_ = fVar158;
                      auVar33._16_4_ = fVar158;
                      auVar33._20_4_ = fVar158;
                      auVar33._24_4_ = fVar158;
                      auVar33._28_4_ = fVar158;
                      uVar152 = vcmpps_avx512vl(auVar195._0_32_,auVar33,2);
                      prim = local_510;
                      pre = local_518;
                      pPVar76 = local_520;
                      if ((bVar80 & (byte)uVar152) == 0) goto LAB_01c7ffd1;
                      local_3e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                      bVar80 = bVar80 & (byte)uVar152;
                      uVar81 = (ulong)bVar80;
                      auVar148._8_4_ = 0x7f800000;
                      auVar148._0_8_ = 0x7f8000007f800000;
                      auVar148._12_4_ = 0x7f800000;
                      auVar148._16_4_ = 0x7f800000;
                      auVar148._20_4_ = 0x7f800000;
                      auVar148._24_4_ = 0x7f800000;
                      auVar148._28_4_ = 0x7f800000;
                      auVar94 = vblendmps_avx512vl(auVar148,auVar195._0_32_);
                      auVar130._0_4_ =
                           (uint)(bVar80 & 1) * auVar94._0_4_ |
                           (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                      bVar15 = (bool)(bVar80 >> 1 & 1);
                      auVar130._4_4_ = (uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar80 >> 2 & 1);
                      auVar130._8_4_ = (uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar80 >> 3 & 1);
                      auVar130._12_4_ = (uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar80 >> 4 & 1);
                      auVar130._16_4_ = (uint)bVar15 * auVar94._16_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar80 >> 5 & 1);
                      auVar130._20_4_ = (uint)bVar15 * auVar94._20_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar80 >> 6 & 1);
                      auVar130._24_4_ = (uint)bVar15 * auVar94._24_4_ | (uint)!bVar15 * 0x7f800000;
                      auVar130._28_4_ =
                           (uint)(bVar80 >> 7) * auVar94._28_4_ |
                           (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
                      auVar94 = vshufps_avx(auVar130,auVar130,0xb1);
                      auVar94 = vminps_avx(auVar130,auVar94);
                      auVar92 = vshufpd_avx(auVar94,auVar94,5);
                      auVar94 = vminps_avx(auVar94,auVar92);
                      auVar92 = vpermpd_avx2(auVar94,0x4e);
                      auVar94 = vminps_avx(auVar94,auVar92);
                      uVar152 = vcmpps_avx512vl(auVar130,auVar94,0);
                      bVar68 = (byte)uVar152 & bVar80;
                      if (bVar68 != 0) {
                        bVar80 = bVar68;
                      }
                      uVar79 = 0;
                      for (uVar71 = (uint)bVar80; (uVar71 & 1) == 0;
                          uVar71 = uVar71 >> 1 | 0x80000000) {
                        uVar79 = uVar79 + 1;
                      }
                      uVar69 = (ulong)uVar79;
                    } while( true );
                  }
                  fVar158 = local_1e0[uVar69];
                  fVar139 = *(float *)(local_1c0 + uVar69 * 4);
                  fVar150 = 1.0 - fVar158;
                  fVar149 = fVar150 * fVar150 * -3.0;
                  auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),
                                            ZEXT416((uint)(fVar158 * fVar150)),ZEXT416(0xc0000000));
                  auVar85 = vfmsub132ss_fma(ZEXT416((uint)(fVar158 * fVar150)),
                                            ZEXT416((uint)(fVar158 * fVar158)),ZEXT416(0x40000000));
                  fVar150 = auVar84._0_4_ * 3.0;
                  fVar151 = auVar85._0_4_ * 3.0;
                  fVar170 = fVar158 * fVar158 * 3.0;
                  auVar184._0_4_ = fVar170 * (float)local_4c0._0_4_;
                  auVar184._4_4_ = fVar170 * (float)local_4c0._4_4_;
                  auVar184._8_4_ = fVar170 * (float)uStack_4b8;
                  auVar184._12_4_ = fVar170 * uStack_4b8._4_4_;
                  auVar188 = ZEXT1664(auVar184);
                  auVar159._4_4_ = fVar151;
                  auVar159._0_4_ = fVar151;
                  auVar159._8_4_ = fVar151;
                  auVar159._12_4_ = fVar151;
                  auVar84 = vfmadd132ps_fma(auVar159,auVar184,local_4b0);
                  auVar172._4_4_ = fVar150;
                  auVar172._0_4_ = fVar150;
                  auVar172._8_4_ = fVar150;
                  auVar172._12_4_ = fVar150;
                  auVar84 = vfmadd132ps_fma(auVar172,auVar84,local_4a0);
                  auVar160._4_4_ = fVar149;
                  auVar160._0_4_ = fVar149;
                  auVar160._8_4_ = fVar149;
                  auVar160._12_4_ = fVar149;
                  auVar183 = ZEXT464((uint)*(float *)(local_1a0 + uVar69 * 4));
                  (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar69 * 4);
                  auVar84 = vfmadd213ps_fma(auVar160,local_4d0,auVar84);
                  uVar152 = vmovlps_avx(auVar84);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar152;
                  fVar149 = (float)vextractps_avx(auVar84,2);
                  (ray->Ng).field_0.field_0.z = fVar149;
                  ray->u = fVar158;
                  ray->v = fVar139;
                  ray->primID = uVar77;
                  ray->geomID = uVar79;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                  prim = local_510;
                  pre = local_518;
                  pPVar76 = local_520;
                }
              }
            }
          }
        }
      }
LAB_01c7ffd1:
      if (8 < iVar74) {
        auVar94 = vpbroadcastd_avx512vl();
        auVar207 = ZEXT3264(auVar94);
        local_3e0._4_4_ = local_420._0_4_;
        local_3e0._0_4_ = local_420._0_4_;
        local_3e0._8_4_ = local_420._0_4_;
        local_3e0._12_4_ = local_420._0_4_;
        local_3e0._16_4_ = local_420._0_4_;
        local_3e0._20_4_ = local_420._0_4_;
        local_3e0._24_4_ = local_420._0_4_;
        local_3e0._28_4_ = local_420._0_4_;
        auVar145._8_4_ = 3;
        auVar145._0_8_ = 0x300000003;
        auVar145._12_4_ = 3;
        auVar145._16_4_ = 3;
        auVar145._20_4_ = 3;
        auVar145._24_4_ = 3;
        auVar145._28_4_ = 3;
        local_3c0 = vpermps_avx2(auVar145,local_3c0);
        local_400._4_4_ = 1.0 / (float)local_440._0_4_;
        local_400._0_4_ = local_400._4_4_;
        fStack_3f8 = (float)local_400._4_4_;
        fStack_3f4 = (float)local_400._4_4_;
        fStack_3f0 = (float)local_400._4_4_;
        fStack_3ec = (float)local_400._4_4_;
        fStack_3e8 = (float)local_400._4_4_;
        fStack_3e4 = (float)local_400._4_4_;
        lVar72 = 8;
        local_4d4 = iVar74;
        local_460 = auVar90;
LAB_01c80068:
        auVar94 = vpbroadcastd_avx512vl();
        auVar94 = vpor_avx2(auVar94,_DAT_01fe9900);
        uVar21 = vpcmpgtd_avx512vl(auVar207._0_32_,auVar94);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 * 4 + lVar22);
        auVar92 = *(undefined1 (*) [32])(lVar22 + 0x21aa768 + lVar72 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar22 + 0x21aabec + lVar72 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar22 + 0x21ab070 + lVar72 * 4);
        auVar195._0_4_ = auVar103._0_4_ * (float)local_380._0_4_;
        auVar195._4_4_ = auVar103._4_4_ * (float)local_380._4_4_;
        auVar195._8_4_ = auVar103._8_4_ * fStack_378;
        auVar195._12_4_ = auVar103._12_4_ * fStack_374;
        auVar195._16_4_ = auVar103._16_4_ * fStack_370;
        auVar195._20_4_ = auVar103._20_4_ * fStack_36c;
        auVar195._28_36_ = auVar188._28_36_;
        auVar195._24_4_ = auVar103._24_4_ * fStack_368;
        auVar188._0_4_ = auVar103._0_4_ * (float)local_3a0._0_4_;
        auVar188._4_4_ = auVar103._4_4_ * (float)local_3a0._4_4_;
        auVar188._8_4_ = auVar103._8_4_ * fStack_398;
        auVar188._12_4_ = auVar103._12_4_ * fStack_394;
        auVar188._16_4_ = auVar103._16_4_ * fStack_390;
        auVar188._20_4_ = auVar103._20_4_ * fStack_38c;
        auVar188._28_36_ = auVar183._28_36_;
        auVar188._24_4_ = auVar103._24_4_ * fStack_388;
        auVar95 = vmulps_avx512vl(local_100,auVar103);
        auVar93 = vfmadd231ps_avx512vl(auVar195._0_32_,auVar104,local_340);
        auVar96 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar104,local_360);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar104,local_e0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar92,local_300);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_320);
        auVar102 = vfmadd231ps_avx512vl(auVar95,auVar92,local_c0);
        auVar84 = vfmadd231ps_fma(auVar93,auVar94,local_2c0);
        auVar188 = ZEXT1664(auVar84);
        auVar85 = vfmadd231ps_fma(auVar96,auVar94,local_2e0);
        auVar183 = ZEXT1664(auVar85);
        auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 * 4 + lVar22);
        auVar93 = *(undefined1 (*) [32])(lVar22 + 0x21acb88 + lVar72 * 4);
        auVar91 = vfmadd231ps_avx512vl(auVar102,auVar94,local_a0);
        auVar96 = *(undefined1 (*) [32])(lVar22 + 0x21ad00c + lVar72 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar22 + 0x21ad490 + lVar72 * 4);
        auVar193._0_4_ = auVar102._0_4_ * (float)local_380._0_4_;
        auVar193._4_4_ = auVar102._4_4_ * (float)local_380._4_4_;
        auVar193._8_4_ = auVar102._8_4_ * fStack_378;
        auVar193._12_4_ = auVar102._12_4_ * fStack_374;
        auVar193._16_4_ = auVar102._16_4_ * fStack_370;
        auVar193._20_4_ = auVar102._20_4_ * fStack_36c;
        auVar193._28_36_ = auVar192._28_36_;
        auVar193._24_4_ = auVar102._24_4_ * fStack_368;
        auVar51._4_4_ = auVar102._4_4_ * (float)local_3a0._4_4_;
        auVar51._0_4_ = auVar102._0_4_ * (float)local_3a0._0_4_;
        auVar51._8_4_ = auVar102._8_4_ * fStack_398;
        auVar51._12_4_ = auVar102._12_4_ * fStack_394;
        auVar51._16_4_ = auVar102._16_4_ * fStack_390;
        auVar51._20_4_ = auVar102._20_4_ * fStack_38c;
        auVar51._24_4_ = auVar102._24_4_ * fStack_388;
        auVar51._28_4_ = uStack_384;
        auVar98 = vmulps_avx512vl(local_100,auVar102);
        auVar97 = vfmadd231ps_avx512vl(auVar193._0_32_,auVar96,local_340);
        auVar99 = vfmadd231ps_avx512vl(auVar51,auVar96,local_360);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,local_e0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_300);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,local_320);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_c0);
        auVar6 = vfmadd231ps_fma(auVar97,auVar95,local_2c0);
        auVar192 = ZEXT1664(auVar6);
        auVar7 = vfmadd231ps_fma(auVar99,auVar95,local_2e0);
        auVar99 = vfmadd231ps_avx512vl(auVar98,auVar95,local_a0);
        auVar100 = vmaxps_avx512vl(auVar91,auVar99);
        auVar98 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar84));
        auVar97 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar85));
        auVar89 = vmulps_avx512vl(ZEXT1632(auVar85),auVar98);
        auVar90 = vmulps_avx512vl(ZEXT1632(auVar84),auVar97);
        auVar89 = vsubps_avx512vl(auVar89,auVar90);
        auVar90 = vmulps_avx512vl(auVar97,auVar97);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar98,auVar98);
        auVar100 = vmulps_avx512vl(auVar100,auVar100);
        auVar100 = vmulps_avx512vl(auVar100,auVar90);
        auVar89 = vmulps_avx512vl(auVar89,auVar89);
        uVar152 = vcmpps_avx512vl(auVar89,auVar100,2);
        bVar80 = (byte)uVar21 & (byte)uVar152;
        if (bVar80 != 0) {
          auVar102 = vmulps_avx512vl(local_180,auVar102);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar102);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar96);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_460,auVar93);
          auVar103 = vmulps_avx512vl(local_180,auVar103);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_160,auVar103);
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_140,auVar104);
          auVar93 = vfmadd213ps_avx512vl(auVar94,local_460,auVar92);
          auVar94 = *(undefined1 (*) [32])(lVar22 + 0x21ab4f4 + lVar72 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar22 + 0x21ab978 + lVar72 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar22 + 0x21abdfc + lVar72 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar22 + 0x21ac280 + lVar72 * 4);
          auVar96 = vmulps_avx512vl(_local_380,auVar103);
          auVar102 = vmulps_avx512vl(_local_3a0,auVar103);
          auVar103 = vmulps_avx512vl(local_180,auVar103);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar104,local_340);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,local_360);
          auVar104 = vfmadd231ps_avx512vl(auVar103,local_160,auVar104);
          auVar103 = vfmadd231ps_avx512vl(auVar96,auVar92,local_300);
          auVar96 = vfmadd231ps_avx512vl(auVar102,auVar92,local_320);
          auVar92 = vfmadd231ps_avx512vl(auVar104,local_140,auVar92);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,local_2c0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,local_2e0);
          auVar8 = vfmadd231ps_fma(auVar92,auVar94,local_460);
          auVar94 = *(undefined1 (*) [32])(lVar22 + 0x21ad914 + lVar72 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar22 + 0x21ae21c + lVar72 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar22 + 0x21ae6a0 + lVar72 * 4);
          auVar102 = vmulps_avx512vl(_local_380,auVar104);
          auVar100 = vmulps_avx512vl(_local_3a0,auVar104);
          auVar104 = vmulps_avx512vl(local_180,auVar104);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar92,local_340);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar92,local_360);
          auVar104 = vfmadd231ps_avx512vl(auVar104,local_160,auVar92);
          auVar92 = *(undefined1 (*) [32])(lVar22 + 0x21add98 + lVar72 * 4);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar92,local_300);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar92,local_320);
          auVar92 = vfmadd231ps_avx512vl(auVar104,local_140,auVar92);
          auVar104 = vfmadd231ps_avx512vl(auVar102,auVar94,local_2c0);
          auVar102 = vfmadd231ps_avx512vl(auVar100,auVar94,local_2e0);
          auVar92 = vfmadd231ps_avx512vl(auVar92,local_460,auVar94);
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar103,auVar100);
          vandps_avx512vl(auVar96,auVar100);
          auVar94 = vmaxps_avx(auVar100,auVar100);
          vandps_avx512vl(ZEXT1632(auVar8),auVar100);
          auVar94 = vmaxps_avx(auVar94,auVar100);
          uVar69 = vcmpps_avx512vl(auVar94,local_3e0,1);
          bVar15 = (bool)((byte)uVar69 & 1);
          auVar118._0_4_ = (float)((uint)bVar15 * auVar98._0_4_ | (uint)!bVar15 * auVar103._0_4_);
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar103._4_4_);
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar103._8_4_);
          bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar103._12_4_)
          ;
          bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar15 * auVar98._16_4_ | (uint)!bVar15 * auVar103._16_4_)
          ;
          bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar15 * auVar98._20_4_ | (uint)!bVar15 * auVar103._20_4_)
          ;
          bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar15 * auVar98._24_4_ | (uint)!bVar15 * auVar103._24_4_)
          ;
          bVar15 = SUB81(uVar69 >> 7,0);
          auVar118._28_4_ = (uint)bVar15 * auVar98._28_4_ | (uint)!bVar15 * auVar103._28_4_;
          bVar15 = (bool)((byte)uVar69 & 1);
          auVar119._0_4_ = (float)((uint)bVar15 * auVar97._0_4_ | (uint)!bVar15 * auVar96._0_4_);
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar96._4_4_);
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar96._8_4_);
          bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar96._12_4_);
          bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * auVar96._16_4_);
          bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * auVar96._20_4_);
          bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * auVar96._24_4_);
          bVar15 = SUB81(uVar69 >> 7,0);
          auVar119._28_4_ = (uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * auVar96._28_4_;
          vandps_avx512vl(auVar104,auVar100);
          vandps_avx512vl(auVar102,auVar100);
          auVar94 = vmaxps_avx(auVar119,auVar119);
          vandps_avx512vl(auVar92,auVar100);
          auVar94 = vmaxps_avx(auVar94,auVar119);
          uVar69 = vcmpps_avx512vl(auVar94,local_3e0,1);
          bVar15 = (bool)((byte)uVar69 & 1);
          auVar120._0_4_ = (uint)bVar15 * auVar98._0_4_ | (uint)!bVar15 * auVar104._0_4_;
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar104._4_4_;
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar104._8_4_;
          bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar104._12_4_;
          bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar120._16_4_ = (uint)bVar15 * auVar98._16_4_ | (uint)!bVar15 * auVar104._16_4_;
          bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar120._20_4_ = (uint)bVar15 * auVar98._20_4_ | (uint)!bVar15 * auVar104._20_4_;
          bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar120._24_4_ = (uint)bVar15 * auVar98._24_4_ | (uint)!bVar15 * auVar104._24_4_;
          bVar15 = SUB81(uVar69 >> 7,0);
          auVar120._28_4_ = (uint)bVar15 * auVar98._28_4_ | (uint)!bVar15 * auVar104._28_4_;
          bVar15 = (bool)((byte)uVar69 & 1);
          auVar121._0_4_ = (float)((uint)bVar15 * auVar97._0_4_ | (uint)!bVar15 * auVar102._0_4_);
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar102._4_4_);
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar102._8_4_);
          bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar102._12_4_)
          ;
          bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * auVar102._16_4_)
          ;
          bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * auVar102._20_4_)
          ;
          bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * auVar102._24_4_)
          ;
          bVar15 = SUB81(uVar69 >> 7,0);
          auVar121._28_4_ = (uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * auVar102._28_4_;
          auVar197._8_4_ = 0x80000000;
          auVar197._0_8_ = 0x8000000080000000;
          auVar197._12_4_ = 0x80000000;
          auVar197._16_4_ = 0x80000000;
          auVar197._20_4_ = 0x80000000;
          auVar197._24_4_ = 0x80000000;
          auVar197._28_4_ = 0x80000000;
          auVar94 = vxorps_avx512vl(auVar120,auVar197);
          auVar88 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
          auVar92 = vfmadd213ps_avx512vl(auVar118,auVar118,ZEXT1632(auVar88));
          auVar8 = vfmadd231ps_fma(auVar92,auVar119,auVar119);
          auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar8));
          auVar206._8_4_ = 0xbf000000;
          auVar206._0_8_ = 0xbf000000bf000000;
          auVar206._12_4_ = 0xbf000000;
          auVar206._16_4_ = 0xbf000000;
          auVar206._20_4_ = 0xbf000000;
          auVar206._24_4_ = 0xbf000000;
          auVar206._28_4_ = 0xbf000000;
          fVar158 = auVar92._0_4_;
          fVar139 = auVar92._4_4_;
          fVar149 = auVar92._8_4_;
          fVar150 = auVar92._12_4_;
          fVar151 = auVar92._16_4_;
          fVar170 = auVar92._20_4_;
          fVar82 = auVar92._24_4_;
          auVar52._4_4_ = fVar139 * fVar139 * fVar139 * auVar8._4_4_ * -0.5;
          auVar52._0_4_ = fVar158 * fVar158 * fVar158 * auVar8._0_4_ * -0.5;
          auVar52._8_4_ = fVar149 * fVar149 * fVar149 * auVar8._8_4_ * -0.5;
          auVar52._12_4_ = fVar150 * fVar150 * fVar150 * auVar8._12_4_ * -0.5;
          auVar52._16_4_ = fVar151 * fVar151 * fVar151 * -0.0;
          auVar52._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
          auVar52._24_4_ = fVar82 * fVar82 * fVar82 * -0.0;
          auVar52._28_4_ = auVar119._28_4_;
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar92 = vfmadd231ps_avx512vl(auVar52,auVar104,auVar92);
          auVar53._4_4_ = auVar119._4_4_ * auVar92._4_4_;
          auVar53._0_4_ = auVar119._0_4_ * auVar92._0_4_;
          auVar53._8_4_ = auVar119._8_4_ * auVar92._8_4_;
          auVar53._12_4_ = auVar119._12_4_ * auVar92._12_4_;
          auVar53._16_4_ = auVar119._16_4_ * auVar92._16_4_;
          auVar53._20_4_ = auVar119._20_4_ * auVar92._20_4_;
          auVar53._24_4_ = auVar119._24_4_ * auVar92._24_4_;
          auVar53._28_4_ = 0;
          auVar54._4_4_ = auVar92._4_4_ * -auVar118._4_4_;
          auVar54._0_4_ = auVar92._0_4_ * -auVar118._0_4_;
          auVar54._8_4_ = auVar92._8_4_ * -auVar118._8_4_;
          auVar54._12_4_ = auVar92._12_4_ * -auVar118._12_4_;
          auVar54._16_4_ = auVar92._16_4_ * -auVar118._16_4_;
          auVar54._20_4_ = auVar92._20_4_ * -auVar118._20_4_;
          auVar54._24_4_ = auVar92._24_4_ * -auVar118._24_4_;
          auVar54._28_4_ = auVar119._28_4_;
          auVar103 = vmulps_avx512vl(auVar92,ZEXT1632(auVar88));
          auVar102 = ZEXT1632(auVar88);
          auVar92 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar102);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar121,auVar121);
          auVar96 = vrsqrt14ps_avx512vl(auVar92);
          auVar92 = vmulps_avx512vl(auVar92,auVar206);
          fVar158 = auVar96._0_4_;
          fVar139 = auVar96._4_4_;
          fVar149 = auVar96._8_4_;
          fVar150 = auVar96._12_4_;
          fVar151 = auVar96._16_4_;
          fVar170 = auVar96._20_4_;
          fVar82 = auVar96._24_4_;
          auVar55._4_4_ = fVar139 * fVar139 * fVar139 * auVar92._4_4_;
          auVar55._0_4_ = fVar158 * fVar158 * fVar158 * auVar92._0_4_;
          auVar55._8_4_ = fVar149 * fVar149 * fVar149 * auVar92._8_4_;
          auVar55._12_4_ = fVar150 * fVar150 * fVar150 * auVar92._12_4_;
          auVar55._16_4_ = fVar151 * fVar151 * fVar151 * auVar92._16_4_;
          auVar55._20_4_ = fVar170 * fVar170 * fVar170 * auVar92._20_4_;
          auVar55._24_4_ = fVar82 * fVar82 * fVar82 * auVar92._24_4_;
          auVar55._28_4_ = auVar92._28_4_;
          auVar92 = vfmadd231ps_avx512vl(auVar55,auVar104,auVar96);
          auVar56._4_4_ = auVar121._4_4_ * auVar92._4_4_;
          auVar56._0_4_ = auVar121._0_4_ * auVar92._0_4_;
          auVar56._8_4_ = auVar121._8_4_ * auVar92._8_4_;
          auVar56._12_4_ = auVar121._12_4_ * auVar92._12_4_;
          auVar56._16_4_ = auVar121._16_4_ * auVar92._16_4_;
          auVar56._20_4_ = auVar121._20_4_ * auVar92._20_4_;
          auVar56._24_4_ = auVar121._24_4_ * auVar92._24_4_;
          auVar56._28_4_ = auVar96._28_4_;
          auVar57._4_4_ = auVar92._4_4_ * auVar94._4_4_;
          auVar57._0_4_ = auVar92._0_4_ * auVar94._0_4_;
          auVar57._8_4_ = auVar92._8_4_ * auVar94._8_4_;
          auVar57._12_4_ = auVar92._12_4_ * auVar94._12_4_;
          auVar57._16_4_ = auVar92._16_4_ * auVar94._16_4_;
          auVar57._20_4_ = auVar92._20_4_ * auVar94._20_4_;
          auVar57._24_4_ = auVar92._24_4_ * auVar94._24_4_;
          auVar57._28_4_ = auVar94._28_4_;
          auVar94 = vmulps_avx512vl(auVar92,auVar102);
          auVar8 = vfmadd213ps_fma(auVar53,auVar91,ZEXT1632(auVar84));
          auVar9 = vfmadd213ps_fma(auVar54,auVar91,ZEXT1632(auVar85));
          auVar104 = vfmadd213ps_avx512vl(auVar103,auVar91,auVar93);
          auVar96 = vfmadd213ps_avx512vl(auVar56,auVar99,ZEXT1632(auVar6));
          auVar11 = vfnmadd213ps_fma(auVar53,auVar91,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar57,auVar99,ZEXT1632(auVar7));
          auVar12 = vfnmadd213ps_fma(auVar54,auVar91,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar94,auVar99,auVar95);
          auVar155 = vfnmadd231ps_fma(auVar93,auVar91,auVar103);
          auVar153 = vfnmadd213ps_fma(auVar56,auVar99,ZEXT1632(auVar6));
          auVar154 = vfnmadd213ps_fma(auVar57,auVar99,ZEXT1632(auVar7));
          auVar86 = vfnmadd231ps_fma(auVar95,auVar99,auVar94);
          auVar95 = vsubps_avx512vl(auVar96,ZEXT1632(auVar11));
          auVar94 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar12));
          auVar92 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar155));
          auVar58._4_4_ = auVar94._4_4_ * auVar155._4_4_;
          auVar58._0_4_ = auVar94._0_4_ * auVar155._0_4_;
          auVar58._8_4_ = auVar94._8_4_ * auVar155._8_4_;
          auVar58._12_4_ = auVar94._12_4_ * auVar155._12_4_;
          auVar58._16_4_ = auVar94._16_4_ * 0.0;
          auVar58._20_4_ = auVar94._20_4_ * 0.0;
          auVar58._24_4_ = auVar94._24_4_ * 0.0;
          auVar58._28_4_ = auVar103._28_4_;
          auVar6 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar12),auVar92);
          auVar59._4_4_ = auVar92._4_4_ * auVar11._4_4_;
          auVar59._0_4_ = auVar92._0_4_ * auVar11._0_4_;
          auVar59._8_4_ = auVar92._8_4_ * auVar11._8_4_;
          auVar59._12_4_ = auVar92._12_4_ * auVar11._12_4_;
          auVar59._16_4_ = auVar92._16_4_ * 0.0;
          auVar59._20_4_ = auVar92._20_4_ * 0.0;
          auVar59._24_4_ = auVar92._24_4_ * 0.0;
          auVar59._28_4_ = auVar92._28_4_;
          auVar7 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar155),auVar95);
          auVar60._4_4_ = auVar12._4_4_ * auVar95._4_4_;
          auVar60._0_4_ = auVar12._0_4_ * auVar95._0_4_;
          auVar60._8_4_ = auVar12._8_4_ * auVar95._8_4_;
          auVar60._12_4_ = auVar12._12_4_ * auVar95._12_4_;
          auVar60._16_4_ = auVar95._16_4_ * 0.0;
          auVar60._20_4_ = auVar95._20_4_ * 0.0;
          auVar60._24_4_ = auVar95._24_4_ * 0.0;
          auVar60._28_4_ = auVar95._28_4_;
          auVar10 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar11),auVar94);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar102,ZEXT1632(auVar7));
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,ZEXT1632(auVar6));
          auVar89 = ZEXT1632(auVar88);
          uVar69 = vcmpps_avx512vl(auVar94,auVar89,2);
          bVar68 = (byte)uVar69;
          fVar131 = (float)((uint)(bVar68 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar153._0_4_);
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar133 = (float)((uint)bVar15 * auVar8._4_4_ | (uint)!bVar15 * auVar153._4_4_);
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar136 = (float)((uint)bVar15 * auVar8._8_4_ | (uint)!bVar15 * auVar153._8_4_);
          bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar137 = (float)((uint)bVar15 * auVar8._12_4_ | (uint)!bVar15 * auVar153._12_4_);
          auVar102 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar136,CONCAT44(fVar133,fVar131))));
          fVar132 = (float)((uint)(bVar68 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar154._0_4_);
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar135 = (float)((uint)bVar15 * auVar9._4_4_ | (uint)!bVar15 * auVar154._4_4_);
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar134 = (float)((uint)bVar15 * auVar9._8_4_ | (uint)!bVar15 * auVar154._8_4_);
          bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar138 = (float)((uint)bVar15 * auVar9._12_4_ | (uint)!bVar15 * auVar154._12_4_);
          auVar98 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar134,CONCAT44(fVar135,fVar132))));
          auVar122._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar86._0_4_);
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar86._4_4_);
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar86._8_4_);
          bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar86._12_4_)
          ;
          fVar139 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar104._16_4_);
          auVar122._16_4_ = fVar139;
          fVar158 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar104._20_4_);
          auVar122._20_4_ = fVar158;
          fVar149 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar104._24_4_);
          auVar122._24_4_ = fVar149;
          iVar1 = (uint)(byte)(uVar69 >> 7) * auVar104._28_4_;
          auVar122._28_4_ = iVar1;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar96);
          auVar123._0_4_ =
               (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar6._0_4_;
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar6._4_4_;
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar6._8_4_;
          bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar6._12_4_;
          auVar123._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_;
          auVar123._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_;
          auVar123._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_;
          auVar123._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar84));
          auVar124._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar8._0_4_
                      );
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar8._4_4_);
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar8._8_4_);
          bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar8._12_4_);
          fVar170 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_);
          auVar124._16_4_ = fVar170;
          fVar151 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_);
          auVar124._20_4_ = fVar151;
          fVar150 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_);
          auVar124._24_4_ = fVar150;
          auVar124._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar155),ZEXT1632(auVar85));
          auVar125._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar9._0_4_
                      );
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar9._4_4_);
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar9._8_4_);
          bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar9._12_4_);
          fVar171 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_);
          auVar125._16_4_ = fVar171;
          fVar82 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_);
          auVar125._20_4_ = fVar82;
          fVar83 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_);
          auVar125._24_4_ = fVar83;
          iVar2 = (uint)(byte)(uVar69 >> 7) * auVar94._28_4_;
          auVar125._28_4_ = iVar2;
          auVar126._0_4_ =
               (uint)(bVar68 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar96._0_4_;
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar15 * (int)auVar11._4_4_ | (uint)!bVar15 * auVar96._4_4_;
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar15 * (int)auVar11._8_4_ | (uint)!bVar15 * auVar96._8_4_;
          bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar15 * (int)auVar11._12_4_ | (uint)!bVar15 * auVar96._12_4_;
          auVar126._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_;
          auVar126._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_;
          auVar126._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_;
          auVar126._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar96._28_4_;
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar69 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar96 = vsubps_avx512vl(auVar126,auVar102);
          auVar92 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar12._12_4_ |
                                                  (uint)!bVar19 * auVar84._12_4_,
                                                  CONCAT48((uint)bVar17 * (int)auVar12._8_4_ |
                                                           (uint)!bVar17 * auVar84._8_4_,
                                                           CONCAT44((uint)bVar15 *
                                                                    (int)auVar12._4_4_ |
                                                                    (uint)!bVar15 * auVar84._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar12._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar84._0_4_)))),auVar98);
          auVar188 = ZEXT3264(auVar92);
          auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar155._12_4_ |
                                                   (uint)!bVar20 * auVar85._12_4_,
                                                   CONCAT48((uint)bVar18 * (int)auVar155._8_4_ |
                                                            (uint)!bVar18 * auVar85._8_4_,
                                                            CONCAT44((uint)bVar16 *
                                                                     (int)auVar155._4_4_ |
                                                                     (uint)!bVar16 * auVar85._4_4_,
                                                                     (uint)(bVar68 & 1) *
                                                                     (int)auVar155._0_4_ |
                                                                     (uint)!(bool)(bVar68 & 1) *
                                                                     auVar85._0_4_)))),auVar122);
          auVar103 = vsubps_avx(auVar102,auVar123);
          auVar192 = ZEXT3264(auVar103);
          auVar95 = vsubps_avx(auVar98,auVar124);
          auVar93 = vsubps_avx(auVar122,auVar125);
          auVar61._4_4_ = auVar104._4_4_ * fVar133;
          auVar61._0_4_ = auVar104._0_4_ * fVar131;
          auVar61._8_4_ = auVar104._8_4_ * fVar136;
          auVar61._12_4_ = auVar104._12_4_ * fVar137;
          auVar61._16_4_ = auVar104._16_4_ * 0.0;
          auVar61._20_4_ = auVar104._20_4_ * 0.0;
          auVar61._24_4_ = auVar104._24_4_ * 0.0;
          auVar61._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar61,auVar122,auVar96);
          auVar177._0_4_ = fVar132 * auVar96._0_4_;
          auVar177._4_4_ = fVar135 * auVar96._4_4_;
          auVar177._8_4_ = fVar134 * auVar96._8_4_;
          auVar177._12_4_ = fVar138 * auVar96._12_4_;
          auVar177._16_4_ = auVar96._16_4_ * 0.0;
          auVar177._20_4_ = auVar96._20_4_ * 0.0;
          auVar177._24_4_ = auVar96._24_4_ * 0.0;
          auVar177._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar177,auVar102,auVar92);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar89,ZEXT1632(auVar84));
          auVar181._0_4_ = auVar92._0_4_ * auVar122._0_4_;
          auVar181._4_4_ = auVar92._4_4_ * auVar122._4_4_;
          auVar181._8_4_ = auVar92._8_4_ * auVar122._8_4_;
          auVar181._12_4_ = auVar92._12_4_ * auVar122._12_4_;
          auVar181._16_4_ = auVar92._16_4_ * fVar139;
          auVar181._20_4_ = auVar92._20_4_ * fVar158;
          auVar181._24_4_ = auVar92._24_4_ * fVar149;
          auVar181._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar181,auVar98,auVar104);
          auVar97 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar84));
          auVar94 = vmulps_avx512vl(auVar93,auVar123);
          auVar94 = vfmsub231ps_avx512vl(auVar94,auVar103,auVar125);
          auVar62._4_4_ = auVar95._4_4_ * auVar125._4_4_;
          auVar62._0_4_ = auVar95._0_4_ * auVar125._0_4_;
          auVar62._8_4_ = auVar95._8_4_ * auVar125._8_4_;
          auVar62._12_4_ = auVar95._12_4_ * auVar125._12_4_;
          auVar62._16_4_ = auVar95._16_4_ * fVar171;
          auVar62._20_4_ = auVar95._20_4_ * fVar82;
          auVar62._24_4_ = auVar95._24_4_ * fVar83;
          auVar62._28_4_ = iVar2;
          auVar84 = vfmsub231ps_fma(auVar62,auVar124,auVar93);
          auVar182._0_4_ = auVar124._0_4_ * auVar103._0_4_;
          auVar182._4_4_ = auVar124._4_4_ * auVar103._4_4_;
          auVar182._8_4_ = auVar124._8_4_ * auVar103._8_4_;
          auVar182._12_4_ = auVar124._12_4_ * auVar103._12_4_;
          auVar182._16_4_ = fVar170 * auVar103._16_4_;
          auVar182._20_4_ = fVar151 * auVar103._20_4_;
          auVar182._24_4_ = fVar150 * auVar103._24_4_;
          auVar182._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar182,auVar95,auVar123);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar89,auVar94);
          auVar100 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar84));
          auVar183 = ZEXT3264(auVar100);
          auVar94 = vmaxps_avx(auVar97,auVar100);
          uVar152 = vcmpps_avx512vl(auVar94,auVar89,2);
          bVar80 = bVar80 & (byte)uVar152;
          if (bVar80 != 0) {
            auVar63._4_4_ = auVar93._4_4_ * auVar92._4_4_;
            auVar63._0_4_ = auVar93._0_4_ * auVar92._0_4_;
            auVar63._8_4_ = auVar93._8_4_ * auVar92._8_4_;
            auVar63._12_4_ = auVar93._12_4_ * auVar92._12_4_;
            auVar63._16_4_ = auVar93._16_4_ * auVar92._16_4_;
            auVar63._20_4_ = auVar93._20_4_ * auVar92._20_4_;
            auVar63._24_4_ = auVar93._24_4_ * auVar92._24_4_;
            auVar63._28_4_ = auVar94._28_4_;
            auVar7 = vfmsub231ps_fma(auVar63,auVar95,auVar104);
            auVar64._4_4_ = auVar104._4_4_ * auVar103._4_4_;
            auVar64._0_4_ = auVar104._0_4_ * auVar103._0_4_;
            auVar64._8_4_ = auVar104._8_4_ * auVar103._8_4_;
            auVar64._12_4_ = auVar104._12_4_ * auVar103._12_4_;
            auVar64._16_4_ = auVar104._16_4_ * auVar103._16_4_;
            auVar64._20_4_ = auVar104._20_4_ * auVar103._20_4_;
            auVar64._24_4_ = auVar104._24_4_ * auVar103._24_4_;
            auVar64._28_4_ = auVar104._28_4_;
            auVar6 = vfmsub231ps_fma(auVar64,auVar96,auVar93);
            auVar65._4_4_ = auVar95._4_4_ * auVar96._4_4_;
            auVar65._0_4_ = auVar95._0_4_ * auVar96._0_4_;
            auVar65._8_4_ = auVar95._8_4_ * auVar96._8_4_;
            auVar65._12_4_ = auVar95._12_4_ * auVar96._12_4_;
            auVar65._16_4_ = auVar95._16_4_ * auVar96._16_4_;
            auVar65._20_4_ = auVar95._20_4_ * auVar96._20_4_;
            auVar65._24_4_ = auVar95._24_4_ * auVar96._24_4_;
            auVar65._28_4_ = auVar95._28_4_;
            auVar8 = vfmsub231ps_fma(auVar65,auVar103,auVar92);
            auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar8));
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar84),ZEXT1632(auVar7),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar94 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
            auVar192 = ZEXT3264(auVar94);
            auVar28._8_4_ = 0x3f800000;
            auVar28._0_8_ = 0x3f8000003f800000;
            auVar28._12_4_ = 0x3f800000;
            auVar28._16_4_ = 0x3f800000;
            auVar28._20_4_ = 0x3f800000;
            auVar28._24_4_ = 0x3f800000;
            auVar28._28_4_ = 0x3f800000;
            auVar92 = vfnmadd213ps_avx512vl(auVar94,ZEXT1632(auVar85),auVar28);
            auVar84 = vfmadd132ps_fma(auVar92,auVar94,auVar94);
            auVar188 = ZEXT1664(auVar84);
            auVar66._4_4_ = auVar8._4_4_ * auVar122._4_4_;
            auVar66._0_4_ = auVar8._0_4_ * auVar122._0_4_;
            auVar66._8_4_ = auVar8._8_4_ * auVar122._8_4_;
            auVar66._12_4_ = auVar8._12_4_ * auVar122._12_4_;
            auVar66._16_4_ = fVar139 * 0.0;
            auVar66._20_4_ = fVar158 * 0.0;
            auVar66._24_4_ = fVar149 * 0.0;
            auVar66._28_4_ = iVar1;
            auVar6 = vfmadd231ps_fma(auVar66,auVar98,ZEXT1632(auVar6));
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar102,ZEXT1632(auVar7));
            fVar139 = auVar84._0_4_;
            fVar149 = auVar84._4_4_;
            fVar150 = auVar84._8_4_;
            fVar151 = auVar84._12_4_;
            local_260 = ZEXT1632(CONCAT412(auVar6._12_4_ * fVar151,
                                           CONCAT48(auVar6._8_4_ * fVar150,
                                                    CONCAT44(auVar6._4_4_ * fVar149,
                                                             auVar6._0_4_ * fVar139))));
            auVar195 = ZEXT3264(local_260);
            uVar152 = vcmpps_avx512vl(local_260,local_3c0,0xd);
            fVar158 = (ray->super_RayK<1>).tfar;
            auVar29._4_4_ = fVar158;
            auVar29._0_4_ = fVar158;
            auVar29._8_4_ = fVar158;
            auVar29._12_4_ = fVar158;
            auVar29._16_4_ = fVar158;
            auVar29._20_4_ = fVar158;
            auVar29._24_4_ = fVar158;
            auVar29._28_4_ = fVar158;
            uVar21 = vcmpps_avx512vl(local_260,auVar29,2);
            bVar80 = (byte)uVar152 & (byte)uVar21 & bVar80;
            if (bVar80 != 0) {
              uVar81 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar81 = bVar80 & uVar81;
              if ((char)uVar81 != '\0') {
                fVar158 = auVar97._0_4_ * fVar139;
                fVar170 = auVar97._4_4_ * fVar149;
                auVar67._4_4_ = fVar170;
                auVar67._0_4_ = fVar158;
                fVar82 = auVar97._8_4_ * fVar150;
                auVar67._8_4_ = fVar82;
                fVar83 = auVar97._12_4_ * fVar151;
                auVar67._12_4_ = fVar83;
                fVar171 = auVar97._16_4_ * 0.0;
                auVar67._16_4_ = fVar171;
                fVar131 = auVar97._20_4_ * 0.0;
                auVar67._20_4_ = fVar131;
                fVar132 = auVar97._24_4_ * 0.0;
                auVar67._24_4_ = fVar132;
                auVar67._28_4_ = auVar97._28_4_;
                auVar169._8_4_ = 0x3f800000;
                auVar169._0_8_ = 0x3f8000003f800000;
                auVar169._12_4_ = 0x3f800000;
                auVar169._16_4_ = 0x3f800000;
                auVar169._20_4_ = 0x3f800000;
                auVar169._24_4_ = 0x3f800000;
                auVar169._28_4_ = 0x3f800000;
                auVar94 = vsubps_avx(auVar169,auVar67);
                local_2a0._0_4_ =
                     (float)((uint)(bVar68 & 1) * (int)fVar158 |
                            (uint)!(bool)(bVar68 & 1) * auVar94._0_4_);
                bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
                local_2a0._4_4_ =
                     (float)((uint)bVar15 * (int)fVar170 | (uint)!bVar15 * auVar94._4_4_);
                bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
                local_2a0._8_4_ =
                     (float)((uint)bVar15 * (int)fVar82 | (uint)!bVar15 * auVar94._8_4_);
                bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
                local_2a0._12_4_ =
                     (float)((uint)bVar15 * (int)fVar83 | (uint)!bVar15 * auVar94._12_4_);
                bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
                local_2a0._16_4_ =
                     (float)((uint)bVar15 * (int)fVar171 | (uint)!bVar15 * auVar94._16_4_);
                bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
                local_2a0._20_4_ =
                     (float)((uint)bVar15 * (int)fVar131 | (uint)!bVar15 * auVar94._20_4_);
                bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
                local_2a0._24_4_ =
                     (float)((uint)bVar15 * (int)fVar132 | (uint)!bVar15 * auVar94._24_4_);
                bVar15 = SUB81(uVar69 >> 7,0);
                local_2a0._28_4_ =
                     (float)((uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * auVar94._28_4_);
                auVar94 = vsubps_avx(auVar99,auVar91);
                auVar84 = vfmadd213ps_fma(auVar94,local_2a0,auVar91);
                fVar158 = pre->depth_scale;
                auVar30._4_4_ = fVar158;
                auVar30._0_4_ = fVar158;
                auVar30._8_4_ = fVar158;
                auVar30._12_4_ = fVar158;
                auVar30._16_4_ = fVar158;
                auVar30._20_4_ = fVar158;
                auVar30._24_4_ = fVar158;
                auVar30._28_4_ = fVar158;
                auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                                             CONCAT48(auVar84._8_4_ + auVar84._8_4_,
                                                                      CONCAT44(auVar84._4_4_ +
                                                                               auVar84._4_4_,
                                                                               auVar84._0_4_ +
                                                                               auVar84._0_4_)))),
                                          auVar30);
                uVar75 = vcmpps_avx512vl(local_260,auVar94,6);
                uVar81 = uVar81 & uVar75;
                uVar79 = (uint)uVar81;
                bVar80 = (byte)uVar81;
                if (bVar80 != 0) {
                  auVar157._0_4_ = auVar100._0_4_ * fVar139;
                  auVar157._4_4_ = auVar100._4_4_ * fVar149;
                  auVar157._8_4_ = auVar100._8_4_ * fVar150;
                  auVar157._12_4_ = auVar100._12_4_ * fVar151;
                  auVar157._16_4_ = auVar100._16_4_ * 0.0;
                  auVar157._20_4_ = auVar100._20_4_ * 0.0;
                  auVar157._24_4_ = auVar100._24_4_ * 0.0;
                  auVar157._28_4_ = 0;
                  auVar178._8_4_ = 0x3f800000;
                  auVar178._0_8_ = 0x3f8000003f800000;
                  auVar178._12_4_ = 0x3f800000;
                  auVar178._16_4_ = 0x3f800000;
                  auVar178._20_4_ = 0x3f800000;
                  auVar178._24_4_ = 0x3f800000;
                  auVar178._28_4_ = 0x3f800000;
                  auVar94 = vsubps_avx(auVar178,auVar157);
                  auVar127._0_4_ =
                       (uint)(bVar68 & 1) * (int)auVar157._0_4_ |
                       (uint)!(bool)(bVar68 & 1) * auVar94._0_4_;
                  bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
                  auVar127._4_4_ =
                       (uint)bVar15 * (int)auVar157._4_4_ | (uint)!bVar15 * auVar94._4_4_;
                  bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
                  auVar127._8_4_ =
                       (uint)bVar15 * (int)auVar157._8_4_ | (uint)!bVar15 * auVar94._8_4_;
                  bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
                  auVar127._12_4_ =
                       (uint)bVar15 * (int)auVar157._12_4_ | (uint)!bVar15 * auVar94._12_4_;
                  bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
                  auVar127._16_4_ =
                       (uint)bVar15 * (int)auVar157._16_4_ | (uint)!bVar15 * auVar94._16_4_;
                  bVar15 = (bool)((byte)(uVar69 >> 5) & 1);
                  auVar127._20_4_ =
                       (uint)bVar15 * (int)auVar157._20_4_ | (uint)!bVar15 * auVar94._20_4_;
                  bVar15 = (bool)((byte)(uVar69 >> 6) & 1);
                  auVar127._24_4_ =
                       (uint)bVar15 * (int)auVar157._24_4_ | (uint)!bVar15 * auVar94._24_4_;
                  auVar127._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar94._28_4_;
                  auVar31._8_4_ = 0x40000000;
                  auVar31._0_8_ = 0x4000000040000000;
                  auVar31._12_4_ = 0x40000000;
                  auVar31._16_4_ = 0x40000000;
                  auVar31._20_4_ = 0x40000000;
                  auVar31._24_4_ = 0x40000000;
                  auVar31._28_4_ = 0x40000000;
                  local_280 = vfmsub132ps_avx512vl(auVar127,auVar178,auVar31);
                  local_240 = (int)lVar72;
                  local_23c = iVar74;
                  auVar192 = ZEXT1664(local_4d0);
                  local_230 = local_4d0;
                  local_220 = local_4a0._0_8_;
                  uStack_218 = local_4a0._8_8_;
                  local_210 = local_4b0._0_8_;
                  uStack_208 = local_4b0._8_8_;
                  local_200 = local_4c0;
                  uStack_1f8 = uStack_4b8;
                  pGVar73 = (context->scene->geometries).items[local_538].ptr;
                  iVar74 = local_4d4;
                  if ((pGVar73->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar84 = vcvtsi2ss_avx512f(auVar88,(int)lVar72);
                    fVar158 = auVar84._0_4_;
                    local_1e0[0] = (fVar158 + local_2a0._0_4_ + 0.0) * (float)local_400._0_4_;
                    local_1e0[1] = (fVar158 + local_2a0._4_4_ + 1.0) * (float)local_400._4_4_;
                    local_1e0[2] = (fVar158 + local_2a0._8_4_ + 2.0) * fStack_3f8;
                    local_1e0[3] = (fVar158 + local_2a0._12_4_ + 3.0) * fStack_3f4;
                    fStack_1d0 = (fVar158 + local_2a0._16_4_ + 4.0) * fStack_3f0;
                    fStack_1cc = (fVar158 + local_2a0._20_4_ + 5.0) * fStack_3ec;
                    fStack_1c8 = (fVar158 + local_2a0._24_4_ + 6.0) * fStack_3e8;
                    fStack_1c4 = fVar158 + local_2a0._28_4_ + 7.0;
                    local_1c0 = local_280;
                    local_1a0 = local_260;
                    auVar146._8_4_ = 0x7f800000;
                    auVar146._0_8_ = 0x7f8000007f800000;
                    auVar146._12_4_ = 0x7f800000;
                    auVar146._16_4_ = 0x7f800000;
                    auVar146._20_4_ = 0x7f800000;
                    auVar146._24_4_ = 0x7f800000;
                    auVar146._28_4_ = 0x7f800000;
                    auVar94 = vblendmps_avx512vl(auVar146,local_260);
                    auVar128._0_4_ =
                         (uint)(bVar80 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000
                    ;
                    bVar15 = (bool)((byte)(uVar81 >> 1) & 1);
                    auVar128._4_4_ = (uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar81 >> 2) & 1);
                    auVar128._8_4_ = (uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar81 >> 3) & 1);
                    auVar128._12_4_ = (uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                    auVar128._16_4_ = (uint)bVar15 * auVar94._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar81 >> 5) & 1);
                    auVar128._20_4_ = (uint)bVar15 * auVar94._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar81 >> 6) & 1);
                    auVar128._24_4_ = (uint)bVar15 * auVar94._24_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = SUB81(uVar81 >> 7,0);
                    auVar128._28_4_ = (uint)bVar15 * auVar94._28_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar94 = vshufps_avx(auVar128,auVar128,0xb1);
                    auVar94 = vminps_avx(auVar128,auVar94);
                    auVar92 = vshufpd_avx(auVar94,auVar94,5);
                    auVar94 = vminps_avx(auVar94,auVar92);
                    auVar92 = vpermpd_avx2(auVar94,0x4e);
                    auVar94 = vminps_avx(auVar94,auVar92);
                    uVar152 = vcmpps_avx512vl(auVar128,auVar94,0);
                    local_4d8 = uVar79;
                    uVar71 = uVar79;
                    if (((byte)uVar152 & bVar80) != 0) {
                      uVar71 = (uint)((byte)uVar152 & bVar80);
                    }
                    uVar70 = 0;
                    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                      uVar70 = uVar70 + 1;
                    }
                    uVar69 = (ulong)uVar70;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar73->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_420 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_120 = vmovdqa64_avx512vl(auVar207._0_32_);
                      local_440 = local_260;
                      local_540 = pGVar73;
                      do {
                        local_484 = local_1e0[uVar69];
                        local_480 = *(undefined4 *)(local_1c0 + uVar69 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar69 * 4);
                        local_508.context = context->user;
                        fVar139 = 1.0 - local_484;
                        fVar158 = fVar139 * fVar139 * -3.0;
                        auVar183 = ZEXT464((uint)fVar158);
                        auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139)),
                                                  ZEXT416((uint)(local_484 * fVar139)),
                                                  ZEXT416(0xc0000000));
                        auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_484 * fVar139)),
                                                  ZEXT416((uint)(local_484 * local_484)),
                                                  ZEXT416(0x40000000));
                        fVar139 = auVar84._0_4_ * 3.0;
                        fVar149 = auVar85._0_4_ * 3.0;
                        fVar150 = local_484 * local_484 * 3.0;
                        auVar186._0_4_ = fVar150 * (float)local_4c0._0_4_;
                        auVar186._4_4_ = fVar150 * (float)local_4c0._4_4_;
                        auVar186._8_4_ = fVar150 * (float)uStack_4b8;
                        auVar186._12_4_ = fVar150 * uStack_4b8._4_4_;
                        auVar188 = ZEXT1664(auVar186);
                        auVar163._4_4_ = fVar149;
                        auVar163._0_4_ = fVar149;
                        auVar163._8_4_ = fVar149;
                        auVar163._12_4_ = fVar149;
                        auVar84 = vfmadd132ps_fma(auVar163,auVar186,local_4b0);
                        auVar174._4_4_ = fVar139;
                        auVar174._0_4_ = fVar139;
                        auVar174._8_4_ = fVar139;
                        auVar174._12_4_ = fVar139;
                        auVar84 = vfmadd132ps_fma(auVar174,auVar84,local_4a0);
                        auVar164._4_4_ = fVar158;
                        auVar164._0_4_ = fVar158;
                        auVar164._8_4_ = fVar158;
                        auVar164._12_4_ = fVar158;
                        auVar84 = vfmadd213ps_fma(auVar164,auVar192._0_16_,auVar84);
                        local_490 = vmovlps_avx(auVar84);
                        local_488 = vextractps_avx(auVar84,2);
                        local_47c = uVar77;
                        local_478 = (int)local_538;
                        local_474 = (local_508.context)->instID[0];
                        local_470 = (local_508.context)->instPrimID[0];
                        local_544 = -1;
                        local_508.valid = &local_544;
                        local_508.geometryUserPtr = pGVar73->userPtr;
                        local_508.ray = (RTCRayN *)ray;
                        local_508.hit = (RTCHitN *)&local_490;
                        local_508.N = 1;
                        if (pGVar73->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c80a94:
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar73->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar183 = ZEXT1664(auVar183._0_16_);
                            auVar188 = ZEXT1664(auVar188._0_16_);
                            (*p_Var14)(&local_508);
                            auVar195 = ZEXT3264(local_440);
                            auVar192 = ZEXT1664(local_4d0);
                            ray = local_530;
                            pGVar73 = local_540;
                            context = local_528;
                            if (*local_508.valid == 0) goto LAB_01c80b37;
                          }
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).components[0] =
                               *(float *)local_508.hit;
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_508.hit + 4);
                          (((Vec3f *)((long)local_508.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_508.hit + 8);
                          *(float *)((long)local_508.ray + 0x3c) = *(float *)(local_508.hit + 0xc);
                          *(float *)((long)local_508.ray + 0x40) = *(float *)(local_508.hit + 0x10);
                          *(float *)((long)local_508.ray + 0x44) = *(float *)(local_508.hit + 0x14);
                          *(float *)((long)local_508.ray + 0x48) = *(float *)(local_508.hit + 0x18);
                          *(float *)((long)local_508.ray + 0x4c) = *(float *)(local_508.hit + 0x1c);
                          *(float *)((long)local_508.ray + 0x50) = *(float *)(local_508.hit + 0x20);
                        }
                        else {
                          auVar183 = ZEXT464((uint)fVar158);
                          auVar188 = ZEXT1664(auVar186);
                          (*pGVar73->intersectionFilterN)(&local_508);
                          auVar195 = ZEXT3264(local_440);
                          auVar192 = ZEXT1664(local_4d0);
                          ray = local_530;
                          pGVar73 = local_540;
                          context = local_528;
                          if (*local_508.valid != 0) goto LAB_01c80a94;
LAB_01c80b37:
                          (local_530->super_RayK<1>).tfar = (float)local_420._0_4_;
                          ray = local_530;
                          pGVar73 = local_540;
                          context = local_528;
                        }
                        bVar80 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar79;
                        fVar158 = (ray->super_RayK<1>).tfar;
                        auVar32._4_4_ = fVar158;
                        auVar32._0_4_ = fVar158;
                        auVar32._8_4_ = fVar158;
                        auVar32._12_4_ = fVar158;
                        auVar32._16_4_ = fVar158;
                        auVar32._20_4_ = fVar158;
                        auVar32._24_4_ = fVar158;
                        auVar32._28_4_ = fVar158;
                        uVar152 = vcmpps_avx512vl(auVar195._0_32_,auVar32,2);
                        if ((bVar80 & (byte)uVar152) == 0) goto LAB_01c80bd5;
                        local_420 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar80 = bVar80 & (byte)uVar152;
                        uVar79 = (uint)bVar80;
                        auVar147._8_4_ = 0x7f800000;
                        auVar147._0_8_ = 0x7f8000007f800000;
                        auVar147._12_4_ = 0x7f800000;
                        auVar147._16_4_ = 0x7f800000;
                        auVar147._20_4_ = 0x7f800000;
                        auVar147._24_4_ = 0x7f800000;
                        auVar147._28_4_ = 0x7f800000;
                        auVar94 = vblendmps_avx512vl(auVar147,auVar195._0_32_);
                        auVar129._0_4_ =
                             (uint)(bVar80 & 1) * auVar94._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                        bVar15 = (bool)(bVar80 >> 1 & 1);
                        auVar129._4_4_ = (uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar80 >> 2 & 1);
                        auVar129._8_4_ = (uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar80 >> 3 & 1);
                        auVar129._12_4_ = (uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar80 >> 4 & 1);
                        auVar129._16_4_ = (uint)bVar15 * auVar94._16_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar80 >> 5 & 1);
                        auVar129._20_4_ = (uint)bVar15 * auVar94._20_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar80 >> 6 & 1);
                        auVar129._24_4_ = (uint)bVar15 * auVar94._24_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        auVar129._28_4_ =
                             (uint)(bVar80 >> 7) * auVar94._28_4_ |
                             (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
                        auVar94 = vshufps_avx(auVar129,auVar129,0xb1);
                        auVar94 = vminps_avx(auVar129,auVar94);
                        auVar92 = vshufpd_avx(auVar94,auVar94,5);
                        auVar94 = vminps_avx(auVar94,auVar92);
                        auVar92 = vpermpd_avx2(auVar94,0x4e);
                        auVar94 = vminps_avx(auVar94,auVar92);
                        uVar152 = vcmpps_avx512vl(auVar129,auVar94,0);
                        bVar68 = (byte)uVar152 & bVar80;
                        if (bVar68 != 0) {
                          bVar80 = bVar68;
                        }
                        uVar71 = 0;
                        for (uVar70 = (uint)bVar80; (uVar70 & 1) == 0;
                            uVar70 = uVar70 >> 1 | 0x80000000) {
                          uVar71 = uVar71 + 1;
                        }
                        uVar69 = (ulong)uVar71;
                      } while( true );
                    }
                    fVar158 = local_1e0[uVar69];
                    fVar139 = *(float *)(local_1c0 + uVar69 * 4);
                    fVar150 = 1.0 - fVar158;
                    fVar149 = fVar150 * fVar150 * -3.0;
                    auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),
                                              ZEXT416((uint)(fVar158 * fVar150)),ZEXT416(0xc0000000)
                                             );
                    auVar85 = vfmsub132ss_fma(ZEXT416((uint)(fVar158 * fVar150)),
                                              ZEXT416((uint)(fVar158 * fVar158)),ZEXT416(0x40000000)
                                             );
                    fVar150 = auVar84._0_4_ * 3.0;
                    fVar151 = auVar85._0_4_ * 3.0;
                    fVar170 = fVar158 * fVar158 * 3.0;
                    auVar185._0_4_ = fVar170 * (float)local_4c0._0_4_;
                    auVar185._4_4_ = fVar170 * (float)local_4c0._4_4_;
                    auVar185._8_4_ = fVar170 * (float)uStack_4b8;
                    auVar185._12_4_ = fVar170 * uStack_4b8._4_4_;
                    auVar188 = ZEXT1664(auVar185);
                    auVar161._4_4_ = fVar151;
                    auVar161._0_4_ = fVar151;
                    auVar161._8_4_ = fVar151;
                    auVar161._12_4_ = fVar151;
                    auVar84 = vfmadd132ps_fma(auVar161,auVar185,local_4b0);
                    auVar173._4_4_ = fVar150;
                    auVar173._0_4_ = fVar150;
                    auVar173._8_4_ = fVar150;
                    auVar173._12_4_ = fVar150;
                    auVar84 = vfmadd132ps_fma(auVar173,auVar84,local_4a0);
                    auVar162._4_4_ = fVar149;
                    auVar162._0_4_ = fVar149;
                    auVar162._8_4_ = fVar149;
                    auVar162._12_4_ = fVar149;
                    auVar183 = ZEXT464((uint)*(float *)(local_1a0 + uVar69 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar69 * 4);
                    auVar84 = vfmadd213ps_fma(auVar162,local_4d0,auVar84);
                    uVar152 = vmovlps_avx(auVar84);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar152;
                    fVar149 = (float)vextractps_avx(auVar84,2);
                    (ray->Ng).field_0.field_0.z = fVar149;
                    ray->u = fVar158;
                    ray->v = fVar139;
                    ray->primID = uVar77;
                    ray->geomID = (uint)local_538;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01c808e9;
      }
LAB_01c7ffd7:
      fVar158 = (ray->super_RayK<1>).tfar;
      auVar27._4_4_ = fVar158;
      auVar27._0_4_ = fVar158;
      auVar27._8_4_ = fVar158;
      auVar27._12_4_ = fVar158;
      auVar27._16_4_ = fVar158;
      auVar27._20_4_ = fVar158;
      auVar27._24_4_ = fVar158;
      auVar27._28_4_ = fVar158;
      uVar152 = vcmpps_avx512vl(local_80,auVar27,2);
      uVar77 = (uint)uVar78 & (uint)uVar152;
      uVar78 = (ulong)uVar77;
    } while (uVar77 != 0);
  }
  return;
LAB_01c80bd5:
  auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar208 = ZEXT3264(auVar94);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar209 = ZEXT1664(auVar84);
  auVar210 = ZEXT464(0x35000000);
  auVar94 = vmovdqa64_avx512vl(local_120);
  auVar207 = ZEXT3264(auVar94);
  prim = local_510;
  pre = local_518;
  pPVar76 = local_520;
  iVar74 = local_4d4;
LAB_01c808e9:
  lVar72 = lVar72 + 8;
  if (iVar74 <= (int)lVar72) goto LAB_01c7ffd7;
  goto LAB_01c80068;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }